

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Mat *this_00;
  Mat *this_01;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [8];
  int iVar49;
  ulong uVar50;
  ulong uVar51;
  void *pvVar52;
  int iVar53;
  ulong uVar54;
  float *pfVar55;
  float *pfVar56;
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  void *pvVar60;
  long lVar61;
  void *pvVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  long lVar68;
  undefined1 auVar69 [8];
  int iVar70;
  int iVar71;
  long lVar72;
  undefined1 auVar73 [8];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined1 in_XMM1 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  undefined1 in_XMM2 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 in_XMM3 [16];
  float fVar164;
  __m128 afVar165;
  binary_op_pow_pack4 op;
  __m128 _p;
  __m128 _b0;
  float *local_e8;
  binary_op_pow_pack4 local_d9;
  void *local_d8;
  undefined8 local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  ulong local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  size_t local_38;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar49 = this_00->elempack;
  iVar53 = this_00[1].elempack;
  if ((iVar53 != 4 && iVar49 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar49 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar49;
  }
  pMVar1 = this_00 + 1;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 1:
    uVar67 = this_00->w;
    uVar51 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar63 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = fVar130 - *pfVar56;
                pfVar55[1] = fVar130 - fVar159;
                pfVar55[2] = fVar130 - fVar161;
                pfVar55[3] = fVar130 - fVar163;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar63 - 1;
                uVar63 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d0) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = fVar130 - *pfVar56;
                pfVar55[1] = fVar130 - fVar159;
                pfVar55[2] = fVar130 - fVar161;
                pfVar55[3] = fVar130 - fVar163;
                lVar61 = lVar61 + 0x10;
                local_d0._0_4_ = (int)local_d0 + -1;
              } while ((int)local_d0 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              fVar130 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < (int)local_d0) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    auVar95 = *(undefined1 (*) [16])
                               ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                    auVar134._0_4_ = fVar130 - auVar95._0_4_;
                    auVar134._4_4_ = fVar130 - auVar95._4_4_;
                    auVar134._8_4_ = fVar130 - auVar95._8_4_;
                    auVar134._12_4_ = fVar130 - auVar95._12_4_;
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar134;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              pfVar55 = (float *)((long)pvVar62 + lVar61);
              fVar163 = pfVar55[1];
              fVar158 = pfVar55[2];
              fVar160 = pfVar55[3];
              pfVar2 = (float *)((long)pvVar52 + lVar61);
              *pfVar2 = *pfVar56 - *pfVar55;
              pfVar2[1] = fVar130 - fVar163;
              pfVar2[2] = fVar159 - fVar158;
              pfVar2[3] = fVar161 - fVar160;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar130 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = *pfVar56 - fVar130;
            pfVar55[1] = fVar159 - fVar130;
            pfVar55[2] = fVar161 - fVar130;
            pfVar55[3] = fVar163 - fVar130;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar51 - 1;
            uVar51 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pfVar56 = (float *)this_00->data;
            pauVar57 = (undefined1 (*) [16])this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar64 = uVar66;
                do {
                  auVar95 = *pauVar57;
                  auVar143._0_4_ = fVar130 - auVar95._0_4_;
                  auVar143._4_4_ = fVar159 - auVar95._4_4_;
                  auVar143._8_4_ = fVar161 - auVar95._8_4_;
                  auVar143._12_4_ = fVar163 - auVar95._12_4_;
                  *pauVar59 = auVar143;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data != (void *)0x0) {
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + uVar51 * 0x10);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                auVar135._0_4_ = fVar130 - auVar95._0_4_;
                auVar135._4_4_ = fVar159 - auVar95._4_4_;
                auVar135._8_4_ = fVar161 - auVar95._8_4_;
                auVar135._12_4_ = fVar163 - auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar135;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pauVar57 = (undefined1 (*) [16])
                           (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data)
                ;
                pfVar56 = (float *)((long)this_00->w * uVar51 * this_00->elemsize +
                                   (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar130 = *pfVar56;
                    fVar159 = pfVar56[1];
                    fVar161 = pfVar56[2];
                    fVar163 = pfVar56[3];
                    uVar64 = uVar66;
                    do {
                      auVar95 = *pauVar57;
                      auVar133._0_4_ = fVar130 - auVar95._0_4_;
                      auVar133._4_4_ = fVar159 - auVar95._4_4_;
                      auVar133._8_4_ = fVar161 - auVar95._8_4_;
                      auVar133._12_4_ = fVar163 - auVar95._12_4_;
                      *pauVar59 = auVar133;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar56 = pfVar56 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar62 + lVar61);
            fVar163 = pfVar55[1];
            fVar158 = pfVar55[2];
            fVar160 = pfVar55[3];
            pfVar2 = (float *)((long)pvVar52 + lVar61);
            *pfVar2 = *pfVar56 - *pfVar55;
            pfVar2[1] = fVar130 - fVar163;
            pfVar2[2] = fVar159 - fVar158;
            pfVar2[3] = fVar161 - fVar160;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pfVar56 = (float *)this_00->data;
            pfVar55 = (float *)this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar50 = uVar51;
                do {
                  auVar123._0_4_ = *pfVar56 - fVar130;
                  auVar123._4_4_ = pfVar56[1] - fVar159;
                  auVar123._8_4_ = pfVar56[2] - fVar161;
                  auVar123._12_4_ = pfVar56[3] - fVar163;
                  *pauVar59 = auVar123;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar55 = pfVar55 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          fVar130 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar52 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)*pauVar59 + lVar61);
            *pfVar55 = *pfVar56 - fVar130;
            pfVar55[1] = fVar159 - fVar130;
            pfVar55[2] = fVar161 - fVar130;
            pfVar55[3] = fVar163 - fVar130;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                pfVar56 = (float *)((long)local_d0->data + uVar50 * 0x10);
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                  auVar117._0_4_ = *pfVar56 - fVar130;
                  auVar117._4_4_ = pfVar56[1] - fVar159;
                  auVar117._8_4_ = pfVar56[2] - fVar161;
                  auVar117._12_4_ = pfVar56[3] - fVar163;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar117
                  ;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar130 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                auVar111._0_4_ = *pfVar56 - fVar130;
                auVar111._4_4_ = pfVar56[1] - fVar130;
                auVar111._8_4_ = pfVar56[2] - fVar130;
                auVar111._12_4_ = pfVar56[3] - fVar130;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar111;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pfVar56 = (float *)((long)this_00[1].w * uVar50 * this_00[1].elemsize +
                               (long)this_00[1].data);
            pfVar55 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar63 = uVar51;
                do {
                  auVar89._0_4_ = *pfVar55 - fVar130;
                  auVar89._4_4_ = pfVar55[1] - fVar159;
                  auVar89._8_4_ = pfVar55[2] - fVar161;
                  auVar89._12_4_ = pfVar55[3] - fVar163;
                  *pauVar59 = auVar89;
                  pfVar55 = pfVar55 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar63 - 1;
                  uVar63 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pfVar56 = (float *)((long)this_00[1].data +
                                 this_00[1].cstep * uVar50 * this_00[1].elemsize);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                auVar76._0_4_ = *pfVar56 - fVar130;
                auVar76._4_4_ = pfVar56[1] - fVar159;
                auVar76._8_4_ = pfVar56[2] - fVar161;
                auVar76._12_4_ = pfVar56[3] - fVar163;
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar76;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                pfVar55 = (float *)((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50);
                *pfVar55 = *pfVar56 - fVar130;
                pfVar55[1] = fVar159 - fVar130;
                pfVar55[2] = fVar161 - fVar130;
                pfVar55[3] = fVar163 - fVar130;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize)
              ;
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                auVar141._0_4_ = fVar130 - auVar95._0_4_;
                auVar141._4_4_ = fVar159 - auVar95._4_4_;
                auVar141._8_4_ = fVar161 - auVar95._8_4_;
                auVar141._12_4_ = fVar163 - auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar141;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 == uVar67) && (iVar49 == 1)) && (uVar65 == uVar5)) && (uVar6 == 1)) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                auVar95 = *(undefined1 (*) [16])
                           ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
                pfVar56 = (float *)((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51);
                *pfVar56 = fVar130 - auVar95._0_4_;
                pfVar56[1] = fVar130 - auVar95._4_4_;
                pfVar56[2] = fVar130 - auVar95._8_4_;
                pfVar56[3] = fVar130 - auVar95._12_4_;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data)
              ;
              uVar63 = 0;
              do {
                if (0 < (int)uVar67) {
                  pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar50 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar54 = uVar51;
                  do {
                    auVar107._0_4_ = *pfVar56 - fVar130;
                    auVar107._4_4_ = pfVar56[1] - fVar159;
                    auVar107._8_4_ = pfVar56[2] - fVar161;
                    auVar107._12_4_ = pfVar56[3] - fVar163;
                    *pauVar59 = auVar107;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)pvVar62 + lVar61);
                    fVar130 = pfVar56[1];
                    fVar159 = pfVar56[2];
                    fVar161 = pfVar56[3];
                    auVar95 = *(undefined1 (*) [16])
                               ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                    pfVar55 = (float *)((long)pvVar60 + lVar61);
                    *pfVar55 = *pfVar56 - auVar95._0_4_;
                    pfVar55[1] = fVar130 - auVar95._4_4_;
                    pfVar55[2] = fVar159 - auVar95._8_4_;
                    pfVar55[3] = fVar161 - auVar95._12_4_;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  pfVar56 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  fVar130 = *pfVar56;
                  fVar159 = pfVar56[1];
                  fVar161 = pfVar56[2];
                  fVar163 = pfVar56[3];
                  uVar67 = uVar66;
                  do {
                    auVar95 = *pauVar57;
                    auVar152._0_4_ = fVar130 - auVar95._0_4_;
                    auVar152._4_4_ = fVar159 - auVar95._4_4_;
                    auVar152._8_4_ = fVar161 - auVar95._8_4_;
                    auVar152._12_4_ = fVar163 - auVar95._12_4_;
                    *pauVar59 = auVar152;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)auVar48 + lVar61);
                    fVar130 = pfVar56[1];
                    fVar159 = pfVar56[2];
                    fVar161 = pfVar56[3];
                    auVar95 = *(undefined1 (*) [16])((long)auVar69 + lVar61);
                    pfVar55 = (float *)((long)auVar73 + lVar61);
                    *pfVar55 = *pfVar56 - auVar95._0_4_;
                    pfVar55[1] = fVar130 - auVar95._4_4_;
                    pfVar55[2] = fVar159 - auVar95._8_4_;
                    pfVar55[3] = fVar161 - auVar95._12_4_;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)auVar48 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              auVar95 = *(undefined1 (*) [16])((long)auVar69 + lVar61);
              pfVar55 = (float *)((long)auVar73 + lVar61);
              *pfVar55 = *pfVar56 - auVar95._0_4_;
              pfVar55[1] = fVar130 - auVar95._4_4_;
              pfVar55[2] = fVar159 - auVar95._8_4_;
              pfVar55[3] = fVar161 - auVar95._12_4_;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 2:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 * fVar130;
                pfVar55[1] = fVar159 * fVar130;
                pfVar55[2] = fVar161 * fVar130;
                pfVar55[3] = fVar163 * fVar130;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d0) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 * fVar130;
                pfVar55[1] = fVar159 * fVar130;
                pfVar55[2] = fVar161 * fVar130;
                pfVar55[3] = fVar163 * fVar130;
                lVar61 = lVar61 + 0x10;
                local_d0._0_4_ = (int)local_d0 + -1;
              } while ((int)local_d0 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              fVar130 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < (int)local_d0) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                    auVar79._0_4_ = *pfVar56 * fVar130;
                    auVar79._4_4_ = pfVar56[1] * fVar130;
                    auVar79._8_4_ = pfVar56[2] * fVar130;
                    auVar79._12_4_ = pfVar56[3] * fVar130;
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar79;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              pfVar55 = (float *)((long)pvVar62 + lVar61);
              fVar163 = pfVar55[1];
              fVar158 = pfVar55[2];
              fVar160 = pfVar55[3];
              pfVar2 = (float *)((long)pvVar52 + lVar61);
              *pfVar2 = *pfVar55 * *pfVar56;
              pfVar2[1] = fVar163 * fVar130;
              pfVar2[2] = fVar158 * fVar159;
              pfVar2[3] = fVar160 * fVar161;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar130 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = *pfVar56 * fVar130;
            pfVar55[1] = fVar159 * fVar130;
            pfVar55[2] = fVar161 * fVar130;
            pfVar55[3] = fVar163 * fVar130;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pfVar56 = (float *)this_00->data;
            pfVar55 = (float *)this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar64 = uVar66;
                do {
                  auVar99._0_4_ = *pfVar55 * fVar130;
                  auVar99._4_4_ = pfVar55[1] * fVar159;
                  auVar99._8_4_ = pfVar55[2] * fVar161;
                  auVar99._12_4_ = pfVar55[3] * fVar163;
                  *pauVar59 = auVar99;
                  pfVar55 = pfVar55 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data != (void *)0x0) {
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + uVar51 * 0x10);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                auVar84._0_4_ = *pfVar56 * fVar130;
                auVar84._4_4_ = pfVar56[1] * fVar159;
                auVar84._8_4_ = pfVar56[2] * fVar161;
                auVar84._12_4_ = pfVar56[3] * fVar163;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar84;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                   (long)this_00[1].data);
                pfVar55 = (float *)((long)this_00->w * uVar51 * this_00->elemsize +
                                   (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar130 = *pfVar55;
                    fVar159 = pfVar55[1];
                    fVar161 = pfVar55[2];
                    fVar163 = pfVar55[3];
                    uVar64 = uVar66;
                    do {
                      auVar78._0_4_ = *pfVar56 * fVar130;
                      auVar78._4_4_ = pfVar56[1] * fVar159;
                      auVar78._8_4_ = pfVar56[2] * fVar161;
                      auVar78._12_4_ = pfVar56[3] * fVar163;
                      *pauVar59 = auVar78;
                      pfVar56 = pfVar56 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar55 = pfVar55 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar62 + lVar61);
            fVar163 = pfVar55[1];
            fVar158 = pfVar55[2];
            fVar160 = pfVar55[3];
            pfVar2 = (float *)((long)pvVar52 + lVar61);
            *pfVar2 = *pfVar55 * *pfVar56;
            pfVar2[1] = fVar163 * fVar130;
            pfVar2[2] = fVar158 * fVar159;
            pfVar2[3] = fVar160 * fVar161;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pfVar56 = (float *)this_00->data;
            pfVar55 = (float *)this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar50 = uVar63;
                do {
                  auVar121._0_4_ = *pfVar56 * fVar130;
                  auVar121._4_4_ = pfVar56[1] * fVar159;
                  auVar121._8_4_ = pfVar56[2] * fVar161;
                  auVar121._12_4_ = pfVar56[3] * fVar163;
                  *pauVar59 = auVar121;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar55 = pfVar55 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          fVar130 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar52 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)*pauVar59 + lVar61);
            *pfVar55 = *pfVar56 * fVar130;
            pfVar55[1] = fVar159 * fVar130;
            pfVar55[2] = fVar161 * fVar130;
            pfVar55[3] = fVar163 * fVar130;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                pfVar56 = (float *)((long)local_d0->data + uVar50 * 0x10);
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                  auVar115._0_4_ = *pfVar56 * fVar130;
                  auVar115._4_4_ = pfVar56[1] * fVar159;
                  auVar115._8_4_ = pfVar56[2] * fVar161;
                  auVar115._12_4_ = pfVar56[3] * fVar163;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar115
                  ;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar130 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                auVar108._0_4_ = *pfVar56 * fVar130;
                auVar108._4_4_ = pfVar56[1] * fVar130;
                auVar108._8_4_ = pfVar56[2] * fVar130;
                auVar108._12_4_ = pfVar56[3] * fVar130;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar108;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pfVar56 = (float *)((long)this_00[1].w * uVar50 * this_00[1].elemsize +
                               (long)this_00[1].data);
            pfVar55 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar51 = uVar63;
                do {
                  auVar87._0_4_ = *pfVar55 * fVar130;
                  auVar87._4_4_ = pfVar55[1] * fVar159;
                  auVar87._8_4_ = pfVar55[2] * fVar161;
                  auVar87._12_4_ = pfVar55[3] * fVar163;
                  *pauVar59 = auVar87;
                  pfVar55 = pfVar55 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pfVar56 = (float *)((long)this_00[1].data +
                                 this_00[1].cstep * uVar50 * this_00[1].elemsize);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                auVar75._0_4_ = *pfVar56 * fVar130;
                auVar75._4_4_ = pfVar56[1] * fVar159;
                auVar75._8_4_ = pfVar56[2] * fVar161;
                auVar75._12_4_ = pfVar56[3] * fVar163;
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar75;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                auVar91._0_4_ = fVar130 * *pfVar56;
                auVar91._4_4_ = fVar130 * pfVar56[1];
                auVar91._8_4_ = fVar130 * pfVar56[2];
                auVar91._12_4_ = fVar130 * pfVar56[3];
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar91;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize)
              ;
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                auVar96._0_4_ = *pfVar56 * fVar130;
                auVar96._4_4_ = pfVar56[1] * fVar159;
                auVar96._8_4_ = pfVar56[2] * fVar161;
                auVar96._12_4_ = pfVar56[3] * fVar163;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar96;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar66 == uVar67) && (iVar49 == 1)) && ((uVar65 == uVar5 && (uVar6 == 1)))) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
                auVar102._0_4_ = *pfVar56 * fVar130;
                auVar102._4_4_ = pfVar56[1] * fVar130;
                auVar102._8_4_ = pfVar56[2] * fVar130;
                auVar102._12_4_ = pfVar56[3] * fVar130;
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                     auVar102;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data)
              ;
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  pfVar55 = (float *)((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar54 = uVar63;
                  do {
                    auVar105._0_4_ = *pfVar56 * fVar130;
                    auVar105._4_4_ = pfVar56[1] * fVar159;
                    auVar105._8_4_ = pfVar56[2] * fVar161;
                    auVar105._12_4_ = pfVar56[3] * fVar163;
                    *pauVar59 = auVar105;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)pvVar62 + lVar61);
                    pfVar55 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                    auVar112._0_4_ = *pfVar55 * *pfVar56;
                    auVar112._4_4_ = pfVar55[1] * pfVar56[1];
                    auVar112._8_4_ = pfVar55[2] * pfVar56[2];
                    auVar112._12_4_ = pfVar55[3] * pfVar56[3];
                    *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar112;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                 (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar67 = uVar66;
                  do {
                    auVar118._0_4_ = *pfVar56 * fVar130;
                    auVar118._4_4_ = pfVar56[1] * fVar159;
                    auVar118._8_4_ = pfVar56[2] * fVar161;
                    auVar118._12_4_ = pfVar56[3] * fVar163;
                    *pauVar59 = auVar118;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)auVar48 + lVar61);
                    pfVar55 = (float *)((long)auVar69 + lVar61);
                    auVar124._0_4_ = *pfVar55 * *pfVar56;
                    auVar124._4_4_ = pfVar55[1] * pfVar56[1];
                    auVar124._8_4_ = pfVar55[2] * pfVar56[2];
                    auVar124._12_4_ = pfVar55[3] * pfVar56[3];
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar124;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)auVar48 + lVar61);
              pfVar55 = (float *)((long)auVar69 + lVar61);
              auVar127._0_4_ = *pfVar55 * *pfVar56;
              auVar127._4_4_ = pfVar55[1] * pfVar56[1];
              auVar127._8_4_ = pfVar55[2] * pfVar56[2];
              auVar127._12_4_ = pfVar55[3] * pfVar56[3];
              *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar127;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 3:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    iVar71 = uVar65 * uVar66;
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar159 = fVar130 * in_XMM2._0_4_;
                fVar161 = fVar130 * in_XMM2._4_4_;
                fVar163 = fVar130 * in_XMM2._8_4_;
                fVar158 = fVar130 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar52 + lVar61);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
                pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
                pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
                pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < iVar71) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar159 = fVar130 * in_XMM2._0_4_;
                fVar161 = fVar130 * in_XMM2._4_4_;
                fVar163 = fVar130 * in_XMM2._8_4_;
                fVar158 = fVar130 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar52 + lVar61);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
                pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
                pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
                pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
                lVar61 = lVar61 + 0x10;
                iVar71 = iVar71 + -1;
              } while (iVar71 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              fVar130 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < iVar71) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = iVar71;
                  do {
                    auVar95 = *(undefined1 (*) [16])
                               ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                    in_XMM2 = rcpps(in_XMM2,auVar95);
                    fVar159 = fVar130 * in_XMM2._0_4_;
                    fVar161 = fVar130 * in_XMM2._4_4_;
                    fVar163 = fVar130 * in_XMM2._8_4_;
                    fVar158 = fVar130 * in_XMM2._12_4_;
                    pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51);
                    *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
                    pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
                    pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
                    pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              auVar95 = *(undefined1 (*) [16])((long)pvVar62 + lVar61);
              in_XMM2 = rcpps(in_XMM2,auVar95);
              fVar163 = *pfVar56 * in_XMM2._0_4_;
              fVar158 = fVar130 * in_XMM2._4_4_;
              fVar160 = fVar159 * in_XMM2._8_4_;
              fVar162 = fVar161 * in_XMM2._12_4_;
              pfVar55 = (float *)((long)pvVar52 + lVar61);
              *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM2._0_4_ + fVar163;
              pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
              pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
              pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar130 = 1.0 / *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = *pfVar56 * fVar130;
            pfVar55[1] = fVar159 * fVar130;
            pfVar55[2] = fVar161 * fVar130;
            pfVar55[3] = fVar163 * fVar130;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pfVar56 = (float *)this_01->data;
        if (pfVar56 == (float *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pfVar55 = (float *)this_00->data;
            pauVar59 = (undefined1 (*) [16])this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar64 = uVar66;
                do {
                  auVar95 = *pauVar59;
                  in_XMM2 = rcpps(in_XMM2,auVar95);
                  fVar158 = fVar130 * in_XMM2._0_4_;
                  fVar160 = fVar159 * in_XMM2._4_4_;
                  fVar162 = fVar161 * in_XMM2._8_4_;
                  fVar164 = fVar163 * in_XMM2._12_4_;
                  *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                  pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                  pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                  pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                  pauVar59 = pauVar59 + 1;
                  pfVar56 = pfVar56 + 4;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pfVar55 = pfVar55 + 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < iVar71) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            pfVar56 = (float *)((long)this_00->data + uVar51 * 0x10);
            fVar130 = *pfVar56;
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = iVar71;
            do {
              auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
              in_XMM2 = rcpps(in_XMM2,auVar95);
              fVar158 = fVar130 * in_XMM2._0_4_;
              fVar160 = fVar159 * in_XMM2._4_4_;
              fVar162 = fVar161 * in_XMM2._8_4_;
              fVar164 = fVar163 * in_XMM2._12_4_;
              pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51);
              *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
              pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
              pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
              pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar71);
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pfVar56 = (float *)(this_01->cstep * uVar51 * this_01->elemsize +
                                   (long)this_01->data);
                pauVar59 = (undefined1 (*) [16])
                           (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data)
                ;
                pfVar55 = (float *)((long)this_00->w * uVar51 * this_00->elemsize +
                                   (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar130 = *pfVar55;
                    fVar159 = pfVar55[1];
                    fVar161 = pfVar55[2];
                    fVar163 = pfVar55[3];
                    uVar64 = uVar66;
                    do {
                      auVar95 = *pauVar59;
                      in_XMM2 = rcpps(in_XMM2,auVar95);
                      fVar158 = fVar130 * in_XMM2._0_4_;
                      fVar160 = fVar159 * in_XMM2._4_4_;
                      fVar162 = fVar161 * in_XMM2._8_4_;
                      fVar164 = fVar163 * in_XMM2._12_4_;
                      *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                      pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                      pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                      pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                      pauVar59 = pauVar59 + 1;
                      pfVar56 = pfVar56 + 4;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar55 = pfVar55 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            auVar95 = *(undefined1 (*) [16])((long)pvVar62 + lVar61);
            in_XMM2 = rcpps(in_XMM2,auVar95);
            fVar163 = *pfVar56 * in_XMM2._0_4_;
            fVar158 = fVar130 * in_XMM2._4_4_;
            fVar160 = fVar159 * in_XMM2._8_4_;
            fVar162 = fVar161 * in_XMM2._12_4_;
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM2._0_4_ + fVar163;
            pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
            pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
            pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pfVar56 = (float *)this_00->data;
            pauVar57 = (undefined1 (*) [16])this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar57;
                in_XMM3 = rcpps(in_XMM3,auVar95);
                fVar130 = in_XMM3._0_4_;
                fVar159 = in_XMM3._4_4_;
                fVar161 = in_XMM3._8_4_;
                fVar163 = in_XMM3._12_4_;
                uVar50 = uVar63;
                do {
                  auVar154._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                  auVar154._4_4_ =
                       pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                  auVar154._8_4_ =
                       pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                  auVar154._12_4_ =
                       pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                  *pauVar59 = auVar154;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          fVar130 = 1.0 / *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar52 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)*pauVar59 + lVar61);
            *pfVar55 = *pfVar56 * fVar130;
            pfVar55[1] = fVar159 * fVar130;
            pfVar55[2] = fVar161 * fVar130;
            pfVar55[3] = fVar163 * fVar130;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                auVar95 = *(undefined1 (*) [16])((long)local_d0->data + uVar50 * 0x10);
                sVar7 = this_01->cstep;
                sVar8 = this_00->cstep;
                in_XMM3 = rcpps(in_XMM3,auVar95);
                fVar130 = in_XMM3._0_4_;
                fVar159 = in_XMM3._4_4_;
                fVar161 = in_XMM3._8_4_;
                fVar163 = in_XMM3._12_4_;
                sVar9 = this_01->elemsize;
                pvVar52 = this_01->data;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar8 * sVar10 * uVar50);
                  auVar150._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                  auVar150._4_4_ =
                       pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                  auVar150._8_4_ =
                       pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                  auVar150._12_4_ =
                       pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar9 * uVar50) = auVar150
                  ;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar130 = 1.0 / *this_00[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                auVar109._0_4_ = *pfVar56 * fVar130;
                auVar109._4_4_ = pfVar56[1] * fVar130;
                auVar109._8_4_ = pfVar56[2] * fVar130;
                auVar109._12_4_ = pfVar56[3] * fVar130;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar109;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)this_00[1].w * uVar50 * this_00[1].elemsize + (long)this_00[1].data);
            pfVar56 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar57;
                in_XMM3 = rcpps(in_XMM3,auVar95);
                fVar130 = in_XMM3._0_4_;
                fVar159 = in_XMM3._4_4_;
                fVar161 = in_XMM3._8_4_;
                fVar163 = in_XMM3._12_4_;
                uVar51 = uVar63;
                do {
                  auVar137._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                  auVar137._4_4_ =
                       pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                  auVar137._8_4_ =
                       pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                  auVar137._12_4_ =
                       pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                  *pauVar59 = auVar137;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_01->cstep;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00[1].data + this_00[1].cstep * uVar50 * this_00[1].elemsize);
              in_XMM3 = rcpps(in_XMM3,auVar95);
              fVar130 = in_XMM3._0_4_;
              fVar159 = in_XMM3._4_4_;
              fVar161 = in_XMM3._8_4_;
              fVar163 = in_XMM3._12_4_;
              sVar9 = this_00->elemsize;
              pvVar52 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar9 * uVar50);
                auVar131._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                auVar131._4_4_ = pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                auVar131._8_4_ = pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                auVar131._12_4_ =
                     pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar8 * sVar10 * uVar50) = auVar131;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])
                           ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
                fVar130 = 1.0 / *(float *)((long)pvVar60 + lVar61);
                auVar139._0_4_ = fVar130 * auVar95._0_4_;
                auVar139._4_4_ = fVar130 * auVar95._4_4_;
                auVar139._8_4_ = fVar130 * auVar95._8_4_;
                auVar139._12_4_ = fVar130 * auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar139;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize)
              ;
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar158 = fVar130 * in_XMM2._0_4_;
                fVar160 = fVar159 * in_XMM2._4_4_;
                fVar162 = fVar161 * in_XMM2._8_4_;
                fVar164 = fVar163 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 == uVar67) && (iVar49 == 1)) && (uVar65 == uVar5)) && (uVar6 == 1)) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                auVar95 = *(undefined1 (*) [16])
                           ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar159 = fVar130 * in_XMM2._0_4_;
                fVar161 = fVar130 * in_XMM2._4_4_;
                fVar163 = fVar130 * in_XMM2._8_4_;
                fVar158 = fVar130 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
                pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
                pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
                pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data)
              ;
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  in_XMM3 = rcpps(in_XMM3,auVar95);
                  fVar130 = in_XMM3._0_4_;
                  fVar159 = in_XMM3._4_4_;
                  fVar161 = in_XMM3._8_4_;
                  fVar163 = in_XMM3._12_4_;
                  uVar54 = uVar63;
                  do {
                    auVar146._0_4_ =
                         *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                    auVar146._4_4_ =
                         pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                    auVar146._8_4_ =
                         pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                    auVar146._12_4_ =
                         pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                    *pauVar59 = auVar146;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)pvVar62 + lVar61);
                    fVar130 = pfVar56[1];
                    fVar159 = pfVar56[2];
                    fVar161 = pfVar56[3];
                    auVar95 = *(undefined1 (*) [16])
                               ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                    in_XMM2 = rcpps(in_XMM2,auVar95);
                    fVar163 = *pfVar56 * in_XMM2._0_4_;
                    fVar158 = fVar130 * in_XMM2._4_4_;
                    fVar160 = fVar159 * in_XMM2._8_4_;
                    fVar162 = fVar161 * in_XMM2._12_4_;
                    pfVar55 = (float *)((long)pvVar60 + lVar61);
                    *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM2._0_4_ + fVar163;
                    pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                    pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                    pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pfVar56 = (float *)(this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data)
              ;
              pauVar59 = (undefined1 (*) [16])
                         (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar67 = uVar66;
                  do {
                    auVar95 = *pauVar59;
                    in_XMM2 = rcpps(in_XMM2,auVar95);
                    fVar158 = fVar130 * in_XMM2._0_4_;
                    fVar160 = fVar159 * in_XMM2._4_4_;
                    fVar162 = fVar161 * in_XMM2._8_4_;
                    fVar164 = fVar163 * in_XMM2._12_4_;
                    *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                    pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                    pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                    pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                    pauVar59 = pauVar59 + 1;
                    pfVar56 = pfVar56 + 4;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar64 == uVar6) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)auVar48 + lVar61);
                    fVar130 = pfVar56[1];
                    fVar159 = pfVar56[2];
                    fVar161 = pfVar56[3];
                    auVar95 = *(undefined1 (*) [16])((long)auVar69 + lVar61);
                    in_XMM2 = rcpps(in_XMM2,auVar95);
                    fVar163 = *pfVar56 * in_XMM2._0_4_;
                    fVar158 = fVar130 * in_XMM2._4_4_;
                    fVar160 = fVar159 * in_XMM2._8_4_;
                    fVar162 = fVar161 * in_XMM2._12_4_;
                    pfVar55 = (float *)((long)auVar73 + lVar61);
                    *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM2._0_4_ + fVar163;
                    pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                    pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                    pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)auVar48 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              auVar95 = *(undefined1 (*) [16])((long)auVar69 + lVar61);
              in_XMM2 = rcpps(in_XMM2,auVar95);
              fVar163 = *pfVar56 * in_XMM2._0_4_;
              fVar158 = fVar130 * in_XMM2._4_4_;
              fVar160 = fVar159 * in_XMM2._8_4_;
              fVar162 = fVar161 * in_XMM2._12_4_;
              pfVar55 = (float *)((long)auVar73 + lVar61);
              *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM2._0_4_ + fVar163;
              pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
              pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
              pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 4:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar3 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar47._4_4_ = uVar3;
                auVar47._0_4_ = uVar3;
                auVar47._8_4_ = uVar3;
                auVar47._12_4_ = uVar3;
                auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar47);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar3 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar46._4_4_ = uVar3;
                auVar46._0_4_ = uVar3;
                auVar46._8_4_ = uVar3;
                auVar46._12_4_ = uVar3;
                auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar46);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
                lVar61 = lVar61 + 0x10;
                local_d0._0_4_ = (int)local_d0 + -1;
              } while ((int)local_d0 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar3 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < (int)local_d0) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    auVar44._4_4_ = uVar3;
                    auVar44._0_4_ = uVar3;
                    auVar44._8_4_ = uVar3;
                    auVar44._12_4_ = uVar3;
                    auVar95 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar44);
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar95;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar62 + lVar61),
                              *(undefined1 (*) [16])((long)pvVar60 + lVar61));
              *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          uVar3 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            auVar45._4_4_ = uVar3;
            auVar45._0_4_ = uVar3;
            auVar45._8_4_ = uVar3;
            auVar45._12_4_ = uVar3;
            auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar45);
            *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pauVar58 = (undefined1 (*) [16])this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                auVar95 = *pauVar57;
                uVar64 = uVar66;
                do {
                  auVar77 = maxps(*pauVar58,auVar95);
                  *pauVar59 = auVar77;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            auVar95 = *(undefined1 (*) [16])((long)this_00->data + uVar51 * 0x10);
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              auVar77 = maxps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar95);
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar77;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pauVar57 = (undefined1 (*) [16])
                           (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data)
                ;
                pauVar58 = (undefined1 (*) [16])
                           ((long)this_00->w * uVar51 * this_00->elemsize + (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar95 = *pauVar58;
                    uVar64 = uVar66;
                    do {
                      auVar77 = maxps(*pauVar57,auVar95);
                      *pauVar59 = auVar77;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar58 = pauVar58 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar62 + lVar61),
                            *(undefined1 (*) [16])((long)pvVar60 + lVar61));
            *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pauVar58 = (undefined1 (*) [16])this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar58;
                uVar50 = uVar63;
                do {
                  auVar77 = maxps(*pauVar57,auVar95);
                  *pauVar59 = auVar77;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar58 = pauVar58 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          uVar3 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            auVar43._4_4_ = uVar3;
            auVar43._0_4_ = uVar3;
            auVar43._8_4_ = uVar3;
            auVar43._12_4_ = uVar3;
            auVar95 = maxps(*(undefined1 (*) [16])((long)pvVar52 + lVar61),auVar43);
            *(undefined1 (*) [16])((long)*pauVar59 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                auVar95 = *(undefined1 (*) [16])((long)local_d0->data + uVar50 * 0x10);
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  auVar77 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50),auVar95);
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar77;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          uVar3 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar42._4_4_ = uVar3;
                auVar42._0_4_ = uVar3;
                auVar42._8_4_ = uVar3;
                auVar42._12_4_ = uVar3;
                auVar95 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50),auVar42);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar95;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)this_00[1].w * uVar50 * this_00[1].elemsize + (long)this_00[1].data);
            pauVar58 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar57;
                uVar51 = uVar63;
                do {
                  auVar77 = maxps(*pauVar58,auVar95);
                  *pauVar59 = auVar77;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00[1].data + this_00[1].cstep * uVar50 * this_00[1].elemsize);
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar77 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50),auVar95);
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar77;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                uVar3 = *(undefined4 *)((long)pvVar60 + lVar61);
                auVar90._4_4_ = uVar3;
                auVar90._0_4_ = uVar3;
                auVar90._8_4_ = uVar3;
                auVar90._12_4_ = uVar3;
                auVar95 = maxps(auVar90,*(undefined1 (*) [16])
                                         ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50));
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar95;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize);
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar77 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar95);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar77;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar66 == uVar67) && (iVar49 == 1)) && ((uVar65 == uVar5 && (uVar6 == 1)))) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                uVar3 = *(undefined4 *)((long)pvVar60 + lVar61);
                auVar41._4_4_ = uVar3;
                auVar41._0_4_ = uVar3;
                auVar41._8_4_ = uVar3;
                auVar41._12_4_ = uVar3;
                auVar95 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51),auVar41);
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                     auVar95;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  uVar54 = uVar63;
                  do {
                    auVar77 = maxps(*pauVar57,auVar95);
                    *pauVar59 = auVar77;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    auVar95 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50),
                                    *(undefined1 (*) [16])((long)pvVar62 + lVar61));
                    *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar95;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  uVar67 = uVar66;
                  do {
                    auVar77 = maxps(*pauVar57,auVar95);
                    *pauVar59 = auVar77;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    auVar95 = maxps(*(undefined1 (*) [16])((long)auVar69 + lVar61),
                                    *(undefined1 (*) [16])((long)auVar48 + lVar61));
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar95;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              auVar95 = maxps(*(undefined1 (*) [16])((long)auVar69 + lVar61),
                              *(undefined1 (*) [16])((long)auVar48 + lVar61));
              *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar95;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 5:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar3 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar40._4_4_ = uVar3;
                auVar40._0_4_ = uVar3;
                auVar40._8_4_ = uVar3;
                auVar40._12_4_ = uVar3;
                auVar95 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar40);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar3 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                auVar39._4_4_ = uVar3;
                auVar39._0_4_ = uVar3;
                auVar39._8_4_ = uVar3;
                auVar39._12_4_ = uVar3;
                auVar95 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar39);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
                lVar61 = lVar61 + 0x10;
                local_d0._0_4_ = (int)local_d0 + -1;
              } while ((int)local_d0 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar3 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < (int)local_d0) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    auVar37._4_4_ = uVar3;
                    auVar37._0_4_ = uVar3;
                    auVar37._8_4_ = uVar3;
                    auVar37._12_4_ = uVar3;
                    auVar95 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar37);
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar95;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              auVar95 = minps(*(undefined1 (*) [16])((long)pvVar62 + lVar61),
                              *(undefined1 (*) [16])((long)pvVar60 + lVar61));
              *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          uVar3 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            auVar38._4_4_ = uVar3;
            auVar38._0_4_ = uVar3;
            auVar38._8_4_ = uVar3;
            auVar38._12_4_ = uVar3;
            auVar95 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar61),auVar38);
            *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pauVar58 = (undefined1 (*) [16])this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                auVar95 = *pauVar57;
                uVar64 = uVar66;
                do {
                  auVar77 = minps(*pauVar58,auVar95);
                  *pauVar59 = auVar77;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            auVar95 = *(undefined1 (*) [16])((long)this_00->data + uVar51 * 0x10);
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              auVar77 = minps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar95);
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar77;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pauVar57 = (undefined1 (*) [16])
                           (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data)
                ;
                pauVar58 = (undefined1 (*) [16])
                           ((long)this_00->w * uVar51 * this_00->elemsize + (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar95 = *pauVar58;
                    uVar64 = uVar66;
                    do {
                      auVar77 = minps(*pauVar57,auVar95);
                      *pauVar59 = auVar77;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar58 = pauVar58 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            auVar95 = minps(*(undefined1 (*) [16])((long)pvVar62 + lVar61),
                            *(undefined1 (*) [16])((long)pvVar60 + lVar61));
            *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pauVar58 = (undefined1 (*) [16])this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar58;
                uVar50 = uVar63;
                do {
                  auVar77 = minps(*pauVar57,auVar95);
                  *pauVar59 = auVar77;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar58 = pauVar58 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          uVar3 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            auVar36._4_4_ = uVar3;
            auVar36._0_4_ = uVar3;
            auVar36._8_4_ = uVar3;
            auVar36._12_4_ = uVar3;
            auVar95 = minps(*(undefined1 (*) [16])((long)pvVar52 + lVar61),auVar36);
            *(undefined1 (*) [16])((long)*pauVar59 + lVar61) = auVar95;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                auVar95 = *(undefined1 (*) [16])((long)local_d0->data + uVar50 * 0x10);
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  auVar77 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50),auVar95);
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar77;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          uVar3 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar35._4_4_ = uVar3;
                auVar35._0_4_ = uVar3;
                auVar35._8_4_ = uVar3;
                auVar35._12_4_ = uVar3;
                auVar95 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50),auVar35);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar95;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)this_00[1].w * uVar50 * this_00[1].elemsize + (long)this_00[1].data);
            pauVar58 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar95 = *pauVar57;
                uVar51 = uVar63;
                do {
                  auVar77 = minps(*pauVar58,auVar95);
                  *pauVar59 = auVar77;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00[1].data + this_00[1].cstep * uVar50 * this_00[1].elemsize);
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar77 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50),auVar95);
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar77;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                uVar3 = *(undefined4 *)((long)pvVar60 + lVar61);
                auVar94._4_4_ = uVar3;
                auVar94._0_4_ = uVar3;
                auVar94._8_4_ = uVar3;
                auVar94._12_4_ = uVar3;
                auVar95 = minps(auVar94,*(undefined1 (*) [16])
                                         ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50));
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar95;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize);
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar77 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51),auVar95);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar77;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 == uVar67) && (iVar49 == 1)) && (uVar65 == uVar5)) && (uVar6 == 1)) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                uVar3 = *(undefined4 *)((long)pvVar60 + lVar61);
                auVar34._4_4_ = uVar3;
                auVar34._0_4_ = uVar3;
                auVar34._8_4_ = uVar3;
                auVar34._12_4_ = uVar3;
                auVar95 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51),auVar34);
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                     auVar95;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  uVar54 = uVar63;
                  do {
                    auVar77 = minps(*pauVar57,auVar95);
                    *pauVar59 = auVar77;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    auVar95 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50),
                                    *(undefined1 (*) [16])((long)pvVar62 + lVar61));
                    *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar95;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00[1].cstep * uVar51 * this_00[1].elemsize + (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  uVar67 = uVar66;
                  do {
                    auVar77 = minps(*pauVar57,auVar95);
                    *pauVar59 = auVar77;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    auVar95 = minps(*(undefined1 (*) [16])((long)auVar69 + lVar61),
                                    *(undefined1 (*) [16])((long)auVar48 + lVar61));
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar95;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              auVar95 = minps(*(undefined1 (*) [16])((long)auVar69 + lVar61),
                              *(undefined1 (*) [16])((long)auVar48 + lVar61));
              *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar95;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 6:
    uVar67 = this_00->w;
    local_c8 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    iVar49 = this_00->elempack;
    uVar66 = this_00[1].w;
    local_b8 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    local_d8 = (void *)(ulong)uVar65;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    iVar71 = uVar65 * uVar66;
    sVar8 = this_00[1].elemsize;
    iVar53 = this_00[1].elempack;
    iVar4 = this_00->dims;
    local_b0 = uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            local_88._4_4_ = *this_00->data;
            local_88._0_4_ = local_88._4_4_;
            uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
            if ((int)local_b8 < 1) {
              return 0;
            }
            pvVar60 = pMVar1->data;
            lVar61 = 0;
            uVar50 = local_b8;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              _local_a8 = *(undefined8 *)pfVar56;
              _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
              afVar165 = binary_op_pow_pack4::operator()
                                   (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
              auVar33._8_4_ = extraout_XMM0_Dc_10;
              auVar33._0_8_ = afVar165._0_8_;
              auVar33._12_4_ = extraout_XMM0_Dd_10;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar33;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar50 - 1;
              uVar50 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            local_88._4_4_ = *this_00->data;
            local_88._0_4_ = local_88._4_4_;
            uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
            if (iVar71 < 1) {
              return 0;
            }
            pvVar60 = pMVar1->data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              _local_a8 = *(undefined8 *)pfVar56;
              _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
              afVar165 = binary_op_pow_pack4::operator()
                                   (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
              auVar32._8_4_ = extraout_XMM0_Dc_09;
              auVar32._0_8_ = afVar165._0_8_;
              auVar32._12_4_ = extraout_XMM0_Dd_09;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar32;
              lVar61 = lVar61 + 0x10;
              iVar71 = iVar71 + -1;
            } while (iVar71 != 0);
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar71);
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            local_88._4_4_ = *this_00->data;
            local_88._0_4_ = local_88._4_4_;
            uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
            if ((int)uVar64 < 1) {
              return 0;
            }
            local_d8 = (void *)0x0;
            do {
              if (0 < (int)local_d0) {
                lVar61 = this_01->cstep * this_01->elemsize * (long)local_d8;
                pvVar52 = this_01->data;
                lVar68 = this_00[1].cstep * this_00[1].elemsize * (long)local_d8;
                pvVar60 = this_00[1].data;
                lVar72 = 0;
                iVar49 = (int)local_d0;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar72 + lVar68);
                  _local_a8 = *(undefined8 *)pfVar56;
                  _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                  auVar27._8_4_ = extraout_XMM0_Dc_01;
                  auVar27._0_8_ = afVar165._0_8_;
                  auVar27._12_4_ = extraout_XMM0_Dd_01;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar72 + lVar61) = auVar27;
                  lVar72 = lVar72 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_d8 = (void *)((long)local_d8 + 1);
            } while (local_d8 != (void *)local_b0);
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 == 1 && this_00[1].w == 1) {
          local_88._4_4_ = *pMVar1->data;
          local_88._0_4_ = local_88._4_4_;
          uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
          if (0 < (int)local_c8) {
            pvVar60 = this_00->data;
            lVar61 = 0;
            uVar50 = local_c8;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              _local_a8 = *(undefined8 *)pfVar56;
              _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
              afVar165 = binary_op_pow_pack4::operator()
                                   (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
              auVar30._8_4_ = extraout_XMM0_Dc_08;
              auVar30._0_8_ = afVar165._0_8_;
              auVar30._12_4_ = extraout_XMM0_Dd_08;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar30;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar50 - 1;
              uVar50 = (ulong)uVar67;
            } while (uVar67 != 0);
          }
        }
        else {
          if ((int)local_c8 < 1) {
            return 0;
          }
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          uVar50 = local_c8;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            local_88 = *(undefined1 (*) [8])pfVar56;
            uStack_80 = *(int **)(pfVar56 + 2);
            pfVar56 = (float *)((long)pvVar62 + lVar61);
            _local_a8 = *(undefined8 *)pfVar56;
            _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
            afVar165 = binary_op_pow_pack4::operator()
                                 (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
            auVar31._8_4_ = extraout_XMM0_Dc_17;
            auVar31._0_8_ = afVar165._0_8_;
            auVar31._12_4_ = extraout_XMM0_Dd_17;
            *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar31;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar50 - 1;
            uVar50 = (ulong)uVar67;
          } while (uVar67 != 0);
        }
      }
      else {
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_01->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d8) {
              local_e8 = (float *)this_00->data;
              pfVar56 = (float *)this_00[1].data;
              local_d0 = (Mat *)((ulong)local_d0._4_4_ << 0x20);
              do {
                local_88 = *(undefined1 (*) [8])local_e8;
                uStack_80 = *(int **)(local_e8 + 2);
                uVar50 = local_b8 & 0xffffffff;
                if (0 < (int)local_b8) {
                  do {
                    _local_a8 = *(undefined8 *)pfVar56;
                    _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                    afVar165 = binary_op_pow_pack4::operator()
                                         (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                    auVar29._8_4_ = extraout_XMM0_Dc_07;
                    auVar29._0_8_ = afVar165._0_8_;
                    auVar29._12_4_ = extraout_XMM0_Dd_07;
                    *pauVar59 = auVar29;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = (int)uVar50 - 1;
                    uVar50 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                local_e8 = local_e8 + 4;
                iVar49 = (int)local_d0 + 1;
                local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar49);
              } while (iVar49 != (int)local_d8);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar71);
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              local_d8 = (void *)0x0;
              do {
                pfVar56 = (float *)((long)this_00->data + (long)local_d8 * 0x10);
                local_88 = *(undefined1 (*) [8])pfVar56;
                uStack_80 = *(int **)(pfVar56 + 2);
                if (0 < (int)local_d0) {
                  lVar68 = this_01->cstep * this_01->elemsize * (long)local_d8;
                  pvVar52 = this_01->data;
                  lVar61 = this_00[1].cstep * this_00[1].elemsize * (long)local_d8;
                  pvVar60 = this_00[1].data;
                  lVar72 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    pfVar56 = (float *)((long)pvVar60 + lVar72 + lVar61);
                    _local_a8 = *(undefined8 *)pfVar56;
                    _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                    afVar165 = binary_op_pow_pack4::operator()
                                         (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                    auVar28._8_4_ = extraout_XMM0_Dc_02;
                    auVar28._0_8_ = afVar165._0_8_;
                    auVar28._12_4_ = extraout_XMM0_Dd_02;
                    *(undefined1 (*) [16])((long)pvVar52 + lVar72 + lVar68) = auVar28;
                    lVar72 = lVar72 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                local_d8 = (void *)((long)local_d8 + 1);
              } while (local_d8 != (void *)local_b0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      return 0;
    }
    uVar5 = this_00->h;
    local_c0 = (ulong)uVar5;
    iVar70 = uVar5 * uVar67;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar6 = this_00->c;
      local_90 = (ulong)uVar6;
      local_38 = sVar7;
      if (this_00[1].dims != 3) {
        Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        local_b0 = CONCAT44(local_b0._4_4_,iVar70);
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        iVar49 = (int)local_90;
        if (this_00[1].dims != 1) {
          if (this_00[1].dims != 2) {
            return 0;
          }
          if (0 < iVar49) {
            local_d8 = (void *)0x0;
            do {
              if (0 < (int)local_c0) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * (long)local_d8 * this_01->elemsize +
                           (long)this_01->data);
                pfVar56 = (float *)((long)this_00[1].w * (long)local_d8 * this_00[1].elemsize +
                                   (long)this_00[1].data);
                pfVar55 = (float *)(this_00->cstep * (long)local_d8 * this_00->elemsize +
                                   (long)this_00->data);
                iVar49 = 0;
                do {
                  local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar49);
                  local_88 = *(undefined1 (*) [8])pfVar56;
                  uStack_80 = *(int **)(pfVar56 + 2);
                  uVar50 = local_c8 & 0xffffffff;
                  if (0 < (int)local_c8) {
                    do {
                      _local_a8 = *(undefined8 *)pfVar55;
                      _fStack_a0 = *(undefined8 *)(pfVar55 + 2);
                      afVar165 = binary_op_pow_pack4::operator()
                                           (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
                      auVar20._8_4_ = extraout_XMM0_Dc_04;
                      auVar20._0_8_ = afVar165._0_8_;
                      auVar20._12_4_ = extraout_XMM0_Dd_04;
                      *pauVar59 = auVar20;
                      pfVar55 = pfVar55 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar67 = (int)uVar50 - 1;
                      uVar50 = (ulong)uVar67;
                    } while (uVar67 != 0);
                  }
                  pfVar56 = pfVar56 + 4;
                  iVar49 = (int)local_d0 + 1;
                } while (iVar49 != (int)local_c0);
              }
              local_d8 = (void *)((long)local_d8 + 1);
            } while (local_d8 != (void *)local_90);
            return 0;
          }
          return 0;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < iVar49) {
            local_d0 = (Mat *)0x0;
            do {
              pvVar52 = this_00->data;
              pfVar56 = (float *)((long)this_00[1].data + (long)local_d0 * 0x10);
              local_88 = *(undefined1 (*) [8])pfVar56;
              uStack_80 = *(int **)(pfVar56 + 2);
              if (0 < (int)(uint)local_b0) {
                lVar72 = this_01->cstep * this_01->elemsize * (long)local_d0;
                pvVar60 = this_01->data;
                lVar61 = this_00->cstep * this_00->elemsize * (long)local_d0;
                lVar68 = 0;
                iVar49 = (uint)local_b0;
                do {
                  pfVar56 = (float *)((long)pvVar52 + lVar68 + lVar61);
                  _local_a8 = *(undefined8 *)pfVar56;
                  _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
                  auVar22._8_4_ = extraout_XMM0_Dc_16;
                  auVar22._0_8_ = afVar165._0_8_;
                  auVar22._12_4_ = extraout_XMM0_Dd_16;
                  *(undefined1 (*) [16])((long)pvVar60 + lVar68 + lVar72) = auVar22;
                  lVar68 = lVar68 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_d0 = (Mat *)((long)local_d0 + 1);
            } while (local_d0 != (Mat *)local_90);
            return 0;
          }
          return 0;
        }
        local_88._4_4_ = *pMVar1->data;
        local_88._0_4_ = local_88._4_4_;
        uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
        if (iVar49 < 1) {
          return 0;
        }
        local_d0 = (Mat *)0x0;
        do {
          if (0 < (int)(uint)local_b0) {
            lVar61 = this_01->cstep * this_01->elemsize * (long)local_d0;
            pvVar52 = this_01->data;
            lVar72 = this_00->cstep * this_00->elemsize * (long)local_d0;
            pvVar60 = this_00->data;
            lVar68 = 0;
            iVar49 = (uint)local_b0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar68 + lVar72);
              _local_a8 = *(undefined8 *)pfVar56;
              _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
              afVar165 = binary_op_pow_pack4::operator()
                                   (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
              auVar21._8_4_ = extraout_XMM0_Dc_14;
              auVar21._0_8_ = afVar165._0_8_;
              auVar21._12_4_ = extraout_XMM0_Dd_14;
              *(undefined1 (*) [16])((long)pvVar52 + lVar68 + lVar61) = auVar21;
              lVar68 = lVar68 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          local_d0 = (Mat *)((long)local_d0 + 1);
        } while (local_d0 != (Mat *)local_90);
        return 0;
      }
      if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
        Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        local_b0 = CONCAT44(local_b0._4_4_,iVar70);
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)(uint)local_90) {
            local_d0 = (Mat *)0x0;
            do {
              pvVar52 = this_00->data;
              pvVar60 = this_01->data;
              pfVar56 = (float *)((long)this_00[1].data +
                                 this_00[1].cstep * (long)local_d0 * this_00[1].elemsize);
              local_88 = *(undefined1 (*) [8])pfVar56;
              uStack_80 = *(int **)(pfVar56 + 2);
              if (0 < (int)(uint)local_b0) {
                lVar68 = this_00->cstep * this_00->elemsize * (long)local_d0;
                lVar61 = this_01->cstep * this_01->elemsize * (long)local_d0;
                lVar72 = 0;
                iVar49 = (uint)local_b0;
                do {
                  pfVar56 = (float *)((long)pvVar52 + lVar72 + lVar68);
                  _local_a8 = *(undefined8 *)pfVar56;
                  _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
                  auVar11._8_4_ = extraout_XMM0_Dc;
                  auVar11._0_8_ = afVar165._0_8_;
                  auVar11._12_4_ = extraout_XMM0_Dd;
                  *(undefined1 (*) [16])((long)pvVar60 + lVar72 + lVar61) = auVar11;
                  lVar72 = lVar72 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_d0 = (Mat *)((long)local_d0 + 1);
            } while (local_d0 != (Mat *)local_90);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
        Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        local_b0 = CONCAT44(local_b0._4_4_,iVar70);
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)(uint)local_90) {
            local_d8 = (void *)0x0;
            do {
              if (0 < (int)(uint)local_b0) {
                lVar68 = this_00->cstep * this_00->elemsize * (long)local_d8;
                pvVar52 = this_00->data;
                local_d0 = (Mat *)this_00[1].data;
                lVar61 = this_01->cstep * this_01->elemsize * (long)local_d8;
                pvVar60 = this_01->data;
                lVar72 = 0;
                iVar49 = (uint)local_b0;
                do {
                  pfVar56 = (float *)((long)pvVar52 + lVar72 * 4 + lVar68);
                  local_88 = *(undefined1 (*) [8])pfVar56;
                  uStack_80 = *(int **)(pfVar56 + 2);
                  fStack_a4 = *(float *)((long)local_d0 + lVar72);
                  local_a8 = fStack_a4;
                  fStack_9c = fStack_a4;
                  fStack_a0 = fStack_a4;
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                  auVar12._8_4_ = extraout_XMM0_Dc_05;
                  auVar12._0_8_ = afVar165._0_8_;
                  auVar12._12_4_ = extraout_XMM0_Dd_05;
                  *(undefined1 (*) [16])((long)pvVar60 + lVar72 * 4 + lVar61) = auVar12;
                  lVar72 = lVar72 + 4;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_d8 = (void *)((long)local_d8 + 1);
            } while (local_d8 != (void *)local_90);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar71);
      if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            local_d8 = (void *)0x0;
            do {
              pvVar52 = this_01->data;
              pvVar60 = this_00[1].data;
              pfVar56 = (float *)((long)this_00->data +
                                 this_00->cstep * (long)local_d8 * this_00->elemsize);
              local_88 = *(undefined1 (*) [8])pfVar56;
              uStack_80 = *(int **)(pfVar56 + 2);
              if (0 < (int)local_d0) {
                lVar68 = this_01->cstep * this_01->elemsize * (long)local_d8;
                lVar61 = this_00[1].cstep * this_00[1].elemsize * (long)local_d8;
                lVar72 = 0;
                iVar49 = (int)local_d0;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar72 + lVar61);
                  _local_a8 = *(undefined8 *)pfVar56;
                  _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                  auVar13._8_4_ = extraout_XMM0_Dc_06;
                  auVar13._0_8_ = afVar165._0_8_;
                  auVar13._12_4_ = extraout_XMM0_Dd_06;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar72 + lVar68) = auVar13;
                  lVar72 = lVar72 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_d8 = (void *)((long)local_d8 + 1);
            } while (local_d8 != (void *)local_b0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar66 == uVar67) && (iVar49 == 1 && (uVar6 == 1 && uVar5 == uVar65))) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)(uint)local_b0) {
            local_b8 = 0;
            do {
              if (0 < (int)local_d0) {
                lVar68 = this_00[1].cstep * this_00[1].elemsize * local_b8;
                pvVar52 = this_00[1].data;
                local_d8 = this_00->data;
                lVar61 = this_01->cstep * this_01->elemsize * local_b8;
                pvVar60 = this_01->data;
                lVar72 = 0;
                iVar49 = (int)local_d0;
                do {
                  local_88._4_4_ = *(float *)((long)local_d8 + lVar72);
                  local_88._0_4_ = local_88._4_4_;
                  uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
                  pfVar56 = (float *)((long)pvVar52 + lVar72 * 4 + lVar68);
                  _local_a8 = *(undefined8 *)pfVar56;
                  _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                  afVar165 = binary_op_pow_pack4::operator()
                                       (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                  auVar14._8_4_ = extraout_XMM0_Dc_11;
                  auVar14._0_8_ = afVar165._0_8_;
                  auVar14._12_4_ = extraout_XMM0_Dd_11;
                  *(undefined1 (*) [16])((long)pvVar60 + lVar72 * 4 + lVar61) = auVar14;
                  lVar72 = lVar72 + 4;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              local_b8 = local_b8 + 1;
            } while (local_b8 != local_b0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
        Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            local_d8 = (void *)0x0;
            do {
              if (0 < (int)local_c0) {
                local_d0 = (Mat *)(this_00[1].cstep * (long)local_d8 * this_00[1].elemsize +
                                  (long)this_00[1].data);
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * (long)local_d8 * this_01->elemsize +
                           (long)this_01->data);
                pfVar56 = (float *)(this_00->cstep * (long)local_d8 * this_00->elemsize +
                                   (long)this_00->data);
                uVar50 = 0;
                do {
                  pfVar55 = (float *)((long)local_d0 + uVar50 * 0x10);
                  local_88 = *(undefined1 (*) [8])pfVar55;
                  uStack_80 = *(int **)(pfVar55 + 2);
                  uVar51 = local_c8 & 0xffffffff;
                  if (0 < (int)local_c8) {
                    do {
                      _local_a8 = *(undefined8 *)pfVar56;
                      _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                      afVar165 = binary_op_pow_pack4::operator()
                                           (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
                      auVar15._8_4_ = extraout_XMM0_Dc_12;
                      auVar15._0_8_ = afVar165._0_8_;
                      auVar15._12_4_ = extraout_XMM0_Dd_12;
                      *pauVar59 = auVar15;
                      pfVar56 = pfVar56 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar67 = (int)uVar51 - 1;
                      uVar51 = (ulong)uVar67;
                    } while (uVar67 != 0);
                  }
                  uVar50 = uVar50 + 1;
                } while (uVar50 != local_c0);
              }
              local_d8 = (void *)((long)local_d8 + 1);
            } while (local_d8 != (void *)local_b0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar65 != 1 || (uVar66 ^ uVar67) != 0) || uVar64 != uVar6) || uVar5 == 1) {
        if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)(uint)local_b0) {
              local_c0 = 0;
              pvVar52 = local_d8;
              do {
                if (0 < (int)pvVar52) {
                  local_d0 = (Mat *)(this_00->cstep * local_c0 * this_00->elemsize +
                                    (long)this_00->data);
                  pauVar59 = (undefined1 (*) [16])
                             (this_01->cstep * local_c0 * this_01->elemsize + (long)this_01->data);
                  pfVar56 = (float *)(this_00[1].cstep * local_c0 * this_00[1].elemsize +
                                     (long)this_00[1].data);
                  uVar50 = 0;
                  do {
                    pfVar55 = (float *)((long)local_d0 + uVar50 * 0x10);
                    local_88 = *(undefined1 (*) [8])pfVar55;
                    uStack_80 = *(int **)(pfVar55 + 2);
                    uVar51 = local_b8 & 0xffffffff;
                    if (0 < (int)local_b8) {
                      do {
                        _local_a8 = *(undefined8 *)pfVar56;
                        _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                        afVar165 = binary_op_pow_pack4::operator()
                                             (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                        auVar17._8_4_ = extraout_XMM0_Dc_18;
                        auVar17._0_8_ = afVar165._0_8_;
                        auVar17._12_4_ = extraout_XMM0_Dd_18;
                        *pauVar59 = auVar17;
                        pfVar56 = pfVar56 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = (int)uVar51 - 1;
                        uVar51 = (ulong)uVar67;
                      } while (uVar67 != 0);
                    }
                    uVar50 = uVar50 + 1;
                    pvVar52 = local_d8;
                  } while ((void *)uVar50 != local_d8);
                }
                local_c0 = local_c0 + 1;
              } while (local_c0 != local_b0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_b0 = CONCAT44(local_b0._4_4_,iVar70);
        if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
          local_d0 = pMVar1;
          local_b0 = uVar50;
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data != (void *)0x0) {
            if ((long)this_01->c * this_01->cstep == 0) {
              return -100;
            }
            if (0 < (int)(uint)local_b0) {
              local_c8 = local_b8 << 4;
              local_90 = 0;
              do {
                iVar49 = (int)local_90;
                Mat::channel((Mat *)local_88,this_00,iVar49);
                auVar48 = local_88;
                Mat::~Mat((Mat *)local_88);
                Mat::channel((Mat *)local_88,local_d0,iVar49);
                auVar69 = local_88;
                Mat::~Mat((Mat *)local_88);
                Mat::channel((Mat *)local_88,this_01,iVar49);
                auVar73 = local_88;
                Mat::~Mat((Mat *)local_88);
                if (0 < (int)local_d8) {
                  iVar49 = 0;
                  pvVar52 = local_d8;
                  do {
                    uVar50 = local_c8;
                    if (0 < (int)local_b8) {
                      local_c0 = CONCAT44(local_c0._4_4_,iVar49);
                      lVar61 = 0;
                      do {
                        local_88 = *(undefined1 (*) [8])((long)auVar48 + lVar61);
                        uStack_80 = (int *)((long *)((long)auVar48 + lVar61))[1];
                        _local_a8 = *(undefined8 *)((long)auVar69 + lVar61);
                        _fStack_a0 = *(undefined8 *)((float *)((long)auVar69 + lVar61) + 2);
                        afVar165 = binary_op_pow_pack4::operator()
                                             (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                        auVar18._8_4_ = extraout_XMM0_Dc_20;
                        auVar18._0_8_ = afVar165._0_8_;
                        auVar18._12_4_ = extraout_XMM0_Dd_20;
                        *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar18;
                        lVar61 = lVar61 + 0x10;
                      } while (uVar50 != lVar61);
                      auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                      auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                      pvVar52 = local_d8;
                      iVar49 = (int)local_c0;
                    }
                    iVar49 = iVar49 + 1;
                  } while (iVar49 != (int)pvVar52);
                }
                uVar67 = (int)local_90 + 1;
                local_90 = (ulong)uVar67;
              } while (uVar67 != (uint)local_b0);
              return 0;
            }
            return 0;
          }
        }
        else {
          local_d0 = pMVar1;
          Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
          if (this_01->data != (void *)0x0) {
            if ((long)this_01->c * this_01->cstep == 0) {
              return -100;
            }
            if (0 < (int)(uint)local_90) {
              local_d8 = (void *)0x0;
              do {
                iVar49 = (int)local_d8;
                Mat::channel((Mat *)local_88,this_00,iVar49);
                auVar48 = local_88;
                Mat::~Mat((Mat *)local_88);
                Mat::channel((Mat *)local_88,local_d0,iVar49);
                auVar69 = local_88;
                Mat::~Mat((Mat *)local_88);
                Mat::channel((Mat *)local_88,this_01,iVar49);
                auVar73 = local_88;
                Mat::~Mat((Mat *)local_88);
                if (0 < (int)(uint)local_b0) {
                  lVar61 = 0;
                  iVar49 = (uint)local_b0;
                  do {
                    local_88 = *(undefined1 (*) [8])((long)auVar48 + lVar61);
                    uStack_80 = (int *)((long *)((long)auVar48 + lVar61))[1];
                    _local_a8 = *(undefined8 *)((long)auVar69 + lVar61);
                    _fStack_a0 = *(undefined8 *)((float *)((long)auVar69 + lVar61) + 2);
                    afVar165 = binary_op_pow_pack4::operator()
                                         (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                    auVar19._8_4_ = extraout_XMM0_Dc_21;
                    auVar19._0_8_ = afVar165._0_8_;
                    auVar19._12_4_ = extraout_XMM0_Dd_21;
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar19;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar67 = (int)local_d8 + 1;
                local_d8 = (void *)(ulong)uVar67;
              } while (uVar67 != (uint)local_90);
              return 0;
            }
            return 0;
          }
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)(uint)local_b0) {
          lVar61 = local_c8 << 4;
          local_d8 = (void *)0x0;
          local_d0 = (Mat *)lVar61;
          do {
            if (0 < (int)local_c0) {
              pvVar60 = (void *)(this_01->cstep * (long)local_d8 * this_01->elemsize +
                                (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * (long)local_d8 * this_00->elemsize +
                                (long)this_00->data);
              lVar68 = this_00[1].elemsize * this_00[1].cstep * (long)local_d8;
              pvVar52 = this_00[1].data;
              iVar49 = 0;
              uVar50 = local_c8;
              uVar51 = local_c0;
              do {
                if (0 < (int)uVar50) {
                  lVar72 = 0;
                  do {
                    local_88 = *(undefined1 (*) [8])((long)pvVar62 + lVar72);
                    uStack_80 = *(int **)((float *)((long)pvVar62 + lVar72) + 2);
                    pfVar56 = (float *)((long)pvVar52 + lVar72 + lVar68);
                    _local_a8 = *(undefined8 *)pfVar56;
                    _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                    afVar165 = binary_op_pow_pack4::operator()
                                         (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                    auVar16._8_4_ = extraout_XMM0_Dc_15;
                    auVar16._0_8_ = afVar165._0_8_;
                    auVar16._12_4_ = extraout_XMM0_Dd_15;
                    *(undefined1 (*) [16])((long)pvVar60 + lVar72) = auVar16;
                    lVar72 = lVar72 + 0x10;
                  } while (lVar61 != lVar72);
                  pvVar60 = (void *)((long)pvVar60 + lVar72);
                  pvVar62 = (void *)((long)pvVar62 + lVar72);
                  uVar50 = local_c8;
                  uVar51 = local_c0;
                }
                iVar49 = iVar49 + 1;
              } while (iVar49 != (int)uVar51);
            }
            local_d8 = (void *)((long)local_d8 + 1);
          } while (local_d8 != (void *)local_b0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (this_00[1].dims == 3) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          local_c0 = 0;
          pvVar52 = local_d8;
          do {
            if (0 < (int)pvVar52) {
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * local_c0 * this_01->elemsize + (long)this_01->data);
              pfVar55 = (float *)(this_00[1].cstep * local_c0 * this_00[1].elemsize +
                                 (long)this_00[1].data);
              pfVar56 = (float *)((long)this_00->w * local_c0 * this_00->elemsize +
                                 (long)this_00->data);
              iVar49 = 0;
              do {
                local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar49);
                local_88 = *(undefined1 (*) [8])pfVar56;
                uStack_80 = *(int **)(pfVar56 + 2);
                uVar50 = local_b8 & 0xffffffff;
                if (0 < (int)local_b8) {
                  do {
                    _local_a8 = *(undefined8 *)pfVar55;
                    _fStack_a0 = *(undefined8 *)(pfVar55 + 2);
                    afVar165 = binary_op_pow_pack4::operator()
                                         (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
                    auVar23._8_4_ = extraout_XMM0_Dc_00;
                    auVar23._0_8_ = afVar165._0_8_;
                    auVar23._12_4_ = extraout_XMM0_Dd_00;
                    *pauVar59 = auVar23;
                    pfVar55 = pfVar55 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = (int)uVar50 - 1;
                    uVar50 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pfVar56 = pfVar56 + 4;
                iVar49 = (int)local_d0 + 1;
                pvVar52 = local_d8;
              } while (iVar49 != (int)local_d8);
            }
            local_c0 = local_c0 + 1;
          } while (local_c0 != local_b0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
    pvVar52 = this_01->data;
    if (pvVar52 == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep == 0) {
      return -100;
    }
    if (this_00[1].dims != 1) {
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < iVar70) {
        pvVar60 = this_00->data;
        pvVar62 = this_00[1].data;
        lVar61 = 0;
        do {
          pfVar56 = (float *)((long)pvVar60 + lVar61);
          local_88 = *(undefined1 (*) [8])pfVar56;
          uStack_80 = *(int **)(pfVar56 + 2);
          pfVar56 = (float *)((long)pvVar62 + lVar61);
          _local_a8 = *(undefined8 *)pfVar56;
          _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
          afVar165 = binary_op_pow_pack4::operator()
                               (&local_d9,(__m128 *)local_88,(__m128 *)&local_a8);
          auVar24._8_4_ = extraout_XMM0_Dc_03;
          auVar24._0_8_ = afVar165._0_8_;
          auVar24._12_4_ = extraout_XMM0_Dd_03;
          *(undefined1 (*) [16])((long)pvVar52 + lVar61) = auVar24;
          lVar61 = lVar61 + 0x10;
          iVar70 = iVar70 + -1;
        } while (iVar70 != 0);
        return 0;
      }
      return 0;
    }
    Mat::create(this_01,(int)local_c8,(int)local_c0,sVar7,iVar49,opt->blob_allocator);
    pauVar59 = (undefined1 (*) [16])this_01->data;
    if (pauVar59 == (undefined1 (*) [16])0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (iVar53 != 1 || this_00[1].w != 1) {
        if (0 < (int)local_c0) {
          pfVar56 = (float *)this_00->data;
          local_e8 = (float *)this_00[1].data;
          local_d0 = (Mat *)((ulong)local_d0._4_4_ << 0x20);
          do {
            local_88 = *(undefined1 (*) [8])local_e8;
            uStack_80 = *(int **)(local_e8 + 2);
            uVar50 = local_c8 & 0xffffffff;
            if (0 < (int)local_c8) {
              do {
                _local_a8 = *(undefined8 *)pfVar56;
                _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
                afVar165 = binary_op_pow_pack4::operator()
                                     (&local_d9,(__m128 *)&local_a8,(__m128 *)local_88);
                auVar26._8_4_ = extraout_XMM0_Dc_19;
                auVar26._0_8_ = afVar165._0_8_;
                auVar26._12_4_ = extraout_XMM0_Dd_19;
                *pauVar59 = auVar26;
                pfVar56 = pfVar56 + 4;
                pauVar59 = pauVar59 + 1;
                uVar67 = (int)uVar50 - 1;
                uVar50 = (ulong)uVar67;
              } while (uVar67 != 0);
            }
            local_e8 = local_e8 + 4;
            iVar49 = (int)local_d0 + 1;
            local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar49);
          } while (iVar49 != (int)local_c0);
          return 0;
        }
        return 0;
      }
      local_88._4_4_ = *pMVar1->data;
      local_88._0_4_ = local_88._4_4_;
      uStack_80 = (int *)CONCAT44(local_88._4_4_,local_88._4_4_);
      if (iVar70 < 1) {
        return 0;
      }
      pvVar52 = this_00->data;
      lVar61 = 0;
      do {
        pfVar56 = (float *)((long)pvVar52 + lVar61);
        _local_a8 = *(undefined8 *)pfVar56;
        _fStack_a0 = *(undefined8 *)(pfVar56 + 2);
        afVar165 = binary_op_pow_pack4::operator()(&local_d9,(__m128 *)&local_a8,(__m128 *)local_88)
        ;
        auVar25._8_4_ = extraout_XMM0_Dc_13;
        auVar25._0_8_ = afVar165._0_8_;
        auVar25._12_4_ = extraout_XMM0_Dd_13;
        *(undefined1 (*) [16])((long)*pauVar59 + lVar61) = auVar25;
        lVar61 = lVar61 + 0x10;
        iVar70 = iVar70 + -1;
      } while (iVar70 != 0);
      return 0;
    }
    return -100;
  case 7:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 - fVar130;
                pfVar55[1] = fVar159 - fVar130;
                pfVar55[2] = fVar161 - fVar130;
                pfVar55[3] = fVar163 - fVar130;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)local_d0) {
              fVar130 = *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 - fVar130;
                pfVar55[1] = fVar159 - fVar130;
                pfVar55[2] = fVar161 - fVar130;
                pfVar55[3] = fVar163 - fVar130;
                lVar61 = lVar61 + 0x10;
                local_d0._0_4_ = (int)local_d0 + -1;
              } while ((int)local_d0 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              fVar130 = *this_00->data;
              uVar51 = 0;
              do {
                if (0 < (int)local_d0) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = (int)local_d0;
                  do {
                    pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                    auVar82._0_4_ = *pfVar56 - fVar130;
                    auVar82._4_4_ = pfVar56[1] - fVar130;
                    auVar82._8_4_ = pfVar56[2] - fVar130;
                    auVar82._12_4_ = pfVar56[3] - fVar130;
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar82;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              pfVar55 = (float *)((long)pvVar62 + lVar61);
              fVar163 = pfVar55[1];
              fVar158 = pfVar55[2];
              fVar160 = pfVar55[3];
              pfVar2 = (float *)((long)pvVar52 + lVar61);
              *pfVar2 = *pfVar55 - *pfVar56;
              pfVar2[1] = fVar163 - fVar130;
              pfVar2[2] = fVar158 - fVar159;
              pfVar2[3] = fVar160 - fVar161;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar130 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = fVar130 - *pfVar56;
            pfVar55[1] = fVar130 - fVar159;
            pfVar55[2] = fVar130 - fVar161;
            pfVar55[3] = fVar130 - fVar163;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pfVar56 = (float *)this_00->data;
            pfVar55 = (float *)this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar64 = uVar66;
                do {
                  auVar100._0_4_ = *pfVar55 - fVar130;
                  auVar100._4_4_ = pfVar55[1] - fVar159;
                  auVar100._8_4_ = pfVar55[2] - fVar161;
                  auVar100._12_4_ = pfVar55[3] - fVar163;
                  *pauVar59 = auVar100;
                  pfVar55 = pfVar55 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            pfVar56 = (float *)((long)this_00->data + uVar51 * 0x10);
            fVar130 = *pfVar56;
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
              auVar85._0_4_ = *pfVar56 - fVar130;
              auVar85._4_4_ = pfVar56[1] - fVar159;
              auVar85._8_4_ = pfVar56[2] - fVar161;
              auVar85._12_4_ = pfVar56[3] - fVar163;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar85;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                   (long)this_00[1].data);
                pfVar55 = (float *)((long)this_00->w * uVar51 * this_00->elemsize +
                                   (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar130 = *pfVar55;
                    fVar159 = pfVar55[1];
                    fVar161 = pfVar55[2];
                    fVar163 = pfVar55[3];
                    uVar64 = uVar66;
                    do {
                      auVar80._0_4_ = *pfVar56 - fVar130;
                      auVar80._4_4_ = pfVar56[1] - fVar159;
                      auVar80._8_4_ = pfVar56[2] - fVar161;
                      auVar80._12_4_ = pfVar56[3] - fVar163;
                      *pauVar59 = auVar80;
                      pfVar56 = pfVar56 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar55 = pfVar55 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar62 + lVar61);
            fVar163 = pfVar55[1];
            fVar158 = pfVar55[2];
            fVar160 = pfVar55[3];
            pfVar2 = (float *)((long)pvVar52 + lVar61);
            *pfVar2 = *pfVar55 - *pfVar56;
            pfVar2[1] = fVar163 - fVar130;
            pfVar2[2] = fVar158 - fVar159;
            pfVar2[3] = fVar160 - fVar161;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pfVar56 = (float *)this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar50 = uVar63;
                do {
                  auVar95 = *pauVar57;
                  auVar155._0_4_ = fVar130 - auVar95._0_4_;
                  auVar155._4_4_ = fVar159 - auVar95._4_4_;
                  auVar155._8_4_ = fVar161 - auVar95._8_4_;
                  auVar155._12_4_ = fVar163 - auVar95._12_4_;
                  *pauVar59 = auVar155;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          fVar130 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar52 + lVar61);
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pfVar55 = (float *)((long)*pauVar59 + lVar61);
            *pfVar55 = fVar130 - *pfVar56;
            pfVar55[1] = fVar130 - fVar159;
            pfVar55[2] = fVar130 - fVar161;
            pfVar55[3] = fVar130 - fVar163;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                pfVar56 = (float *)((long)local_d0->data + uVar50 * 0x10);
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50)
                  ;
                  auVar151._0_4_ = fVar130 - auVar95._0_4_;
                  auVar151._4_4_ = fVar159 - auVar95._4_4_;
                  auVar151._8_4_ = fVar161 - auVar95._8_4_;
                  auVar151._12_4_ = fVar163 - auVar95._12_4_;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar151
                  ;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar130 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                auVar148._0_4_ = fVar130 - auVar95._0_4_;
                auVar148._4_4_ = fVar130 - auVar95._4_4_;
                auVar148._8_4_ = fVar130 - auVar95._8_4_;
                auVar148._12_4_ = fVar130 - auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar148;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pfVar56 = (float *)((long)this_00[1].w * uVar50 * this_00[1].elemsize +
                               (long)this_00[1].data);
            pauVar57 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                uVar51 = uVar63;
                do {
                  auVar95 = *pauVar57;
                  auVar138._0_4_ = fVar130 - auVar95._0_4_;
                  auVar138._4_4_ = fVar159 - auVar95._4_4_;
                  auVar138._8_4_ = fVar161 - auVar95._8_4_;
                  auVar138._12_4_ = fVar163 - auVar95._12_4_;
                  *pauVar59 = auVar138;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar56 = pfVar56 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pfVar56 = (float *)((long)this_00[1].data +
                                 this_00[1].cstep * uVar50 * this_00[1].elemsize);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                auVar132._0_4_ = fVar130 - auVar95._0_4_;
                auVar132._4_4_ = fVar159 - auVar95._4_4_;
                auVar132._8_4_ = fVar161 - auVar95._8_4_;
                auVar132._12_4_ = fVar163 - auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar132;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                auVar92._0_4_ = fVar130 - *pfVar56;
                auVar92._4_4_ = fVar130 - pfVar56[1];
                auVar92._8_4_ = fVar130 - pfVar56[2];
                auVar92._12_4_ = fVar130 - pfVar56[3];
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar92;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize)
              ;
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00[1].cstep;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                auVar97._0_4_ = *pfVar56 - fVar130;
                auVar97._4_4_ = pfVar56[1] - fVar159;
                auVar97._8_4_ = pfVar56[2] - fVar161;
                auVar97._12_4_ = pfVar56[3] - fVar163;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar97;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar66 == uVar67) && (iVar49 == 1)) && ((uVar65 == uVar5 && (uVar6 == 1)))) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
                auVar103._0_4_ = *pfVar56 - fVar130;
                auVar103._4_4_ = pfVar56[1] - fVar130;
                auVar103._8_4_ = pfVar56[2] - fVar130;
                auVar103._12_4_ = pfVar56[3] - fVar130;
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                     auVar103;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pauVar57 = (undefined1 (*) [16])
                         (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  pfVar56 = (float *)((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  fVar130 = *pfVar56;
                  fVar159 = pfVar56[1];
                  fVar161 = pfVar56[2];
                  fVar163 = pfVar56[3];
                  uVar54 = uVar63;
                  do {
                    auVar95 = *pauVar57;
                    auVar147._0_4_ = fVar130 - auVar95._0_4_;
                    auVar147._4_4_ = fVar159 - auVar95._4_4_;
                    auVar147._8_4_ = fVar161 - auVar95._8_4_;
                    auVar147._12_4_ = fVar163 - auVar95._12_4_;
                    *pauVar59 = auVar147;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)pvVar62 + lVar61);
                    pfVar55 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                    auVar113._0_4_ = *pfVar55 - *pfVar56;
                    auVar113._4_4_ = pfVar55[1] - pfVar56[1];
                    auVar113._8_4_ = pfVar55[2] - pfVar56[2];
                    auVar113._12_4_ = pfVar55[3] - pfVar56[3];
                    *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar113;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                 (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar67 = uVar66;
                  do {
                    auVar119._0_4_ = *pfVar56 - fVar130;
                    auVar119._4_4_ = pfVar56[1] - fVar159;
                    auVar119._8_4_ = pfVar56[2] - fVar161;
                    auVar119._12_4_ = pfVar56[3] - fVar163;
                    *pauVar59 = auVar119;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    pfVar56 = (float *)((long)auVar48 + lVar61);
                    pfVar55 = (float *)((long)auVar69 + lVar61);
                    auVar125._0_4_ = *pfVar55 - *pfVar56;
                    auVar125._4_4_ = pfVar55[1] - pfVar56[1];
                    auVar125._8_4_ = pfVar55[2] - pfVar56[2];
                    auVar125._12_4_ = pfVar55[3] - pfVar56[3];
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar125;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)auVar48 + lVar61);
              pfVar55 = (float *)((long)auVar69 + lVar61);
              auVar128._0_4_ = *pfVar55 - *pfVar56;
              auVar128._4_4_ = pfVar55[1] - pfVar56[1];
              auVar128._8_4_ = pfVar55[2] - pfVar56[2];
              auVar128._12_4_ = pfVar55[3] - pfVar56[3];
              *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar128;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  case 8:
    uVar67 = this_00->w;
    uVar63 = (ulong)uVar67;
    sVar7 = this_00->elemsize;
    uVar66 = this_00[1].w;
    uVar51 = (ulong)uVar66;
    uVar65 = this_00[1].h;
    uVar64 = this_00[1].c;
    uVar50 = (ulong)uVar64;
    iVar71 = uVar65 * uVar66;
    sVar8 = this_00[1].elemsize;
    iVar4 = this_00->dims;
    local_d8 = (void *)uVar50;
    if (iVar4 == 1) {
      if (iVar49 == 1 && uVar67 == 1) {
        iVar4 = this_00[1].dims;
        if (iVar4 == 1) {
          Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar66) {
              fVar130 = 1.0 / *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 * fVar130;
                pfVar55[1] = fVar159 * fVar130;
                pfVar55[2] = fVar161 * fVar130;
                pfVar55[3] = fVar163 * fVar130;
                lVar61 = lVar61 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 2) {
          Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
          pvVar52 = this_01->data;
          if (pvVar52 == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < iVar71) {
              fVar130 = 1.0 / *this_00->data;
              pvVar60 = pMVar1->data;
              lVar61 = 0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61);
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pfVar55 = (float *)((long)pvVar52 + lVar61);
                *pfVar55 = *pfVar56 * fVar130;
                pfVar55[1] = fVar159 * fVar130;
                pfVar55[2] = fVar161 * fVar130;
                pfVar55[3] = fVar163 * fVar130;
                lVar61 = lVar61 + 0x10;
                iVar71 = iVar71 + -1;
              } while (iVar71 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar4 == 3) {
          Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
          if (this_01->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_01->c * this_01->cstep != 0) {
            if (0 < (int)uVar64) {
              fVar130 = 1.0 / *this_00->data;
              uVar51 = 0;
              do {
                if (0 < iVar71) {
                  sVar7 = this_01->cstep;
                  sVar8 = this_01->elemsize;
                  pvVar52 = this_01->data;
                  sVar9 = this_00[1].cstep;
                  sVar10 = this_00[1].elemsize;
                  pvVar60 = this_00[1].data;
                  lVar61 = 0;
                  iVar49 = iVar71;
                  do {
                    pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                    auVar95._0_4_ = *pfVar56 * fVar130;
                    auVar95._4_4_ = pfVar56[1] * fVar130;
                    auVar95._8_4_ = pfVar56[2] * fVar130;
                    auVar95._12_4_ = pfVar56[3] * fVar130;
                    *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) =
                         auVar95;
                    lVar61 = lVar61 + 0x10;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep == 0) {
          return -100;
        }
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = this_00->data;
            pvVar62 = this_00[1].data;
            lVar61 = 0;
            do {
              auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61);
              in_XMM1 = rcpps(in_XMM1,auVar95);
              pfVar56 = (float *)((long)pvVar62 + lVar61);
              fVar130 = pfVar56[1];
              fVar159 = pfVar56[2];
              fVar161 = pfVar56[3];
              fVar163 = *pfVar56 * in_XMM1._0_4_;
              fVar158 = fVar130 * in_XMM1._4_4_;
              fVar160 = fVar159 * in_XMM1._8_4_;
              fVar162 = fVar161 * in_XMM1._12_4_;
              pfVar55 = (float *)((long)pvVar52 + lVar61);
              *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM1._0_4_ + fVar163;
              pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM1._4_4_ + fVar158;
              pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM1._8_4_ + fVar160;
              pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM1._12_4_ + fVar162;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar130 = *pMVar1->data;
          pvVar60 = this_00->data;
          lVar61 = 0;
          do {
            auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61);
            in_XMM2 = rcpps(in_XMM2,auVar95);
            fVar159 = fVar130 * in_XMM2._0_4_;
            fVar161 = fVar130 * in_XMM2._4_4_;
            fVar163 = fVar130 * in_XMM2._8_4_;
            fVar158 = fVar130 * in_XMM2._12_4_;
            pfVar56 = (float *)((long)pvVar52 + lVar61);
            *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
            pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
            pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
            pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar63 - 1;
            uVar63 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_01->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar65) {
            pauVar57 = (undefined1 (*) [16])this_00->data;
            pfVar56 = (float *)this_00[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                auVar95 = *pauVar57;
                in_XMM3 = rcpps(in_XMM3,auVar95);
                fVar130 = in_XMM3._0_4_;
                fVar159 = in_XMM3._4_4_;
                fVar161 = in_XMM3._8_4_;
                fVar163 = in_XMM3._12_4_;
                uVar64 = uVar66;
                do {
                  auVar144._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                  auVar144._4_4_ =
                       pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                  auVar144._8_4_ =
                       pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                  auVar144._12_4_ =
                       pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                  *pauVar59 = auVar144;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 != 3) {
        return 0;
      }
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < iVar71) {
            auVar95 = *(undefined1 (*) [16])((long)this_00->data + uVar51 * 0x10);
            sVar7 = this_01->cstep;
            sVar8 = this_00[1].cstep;
            in_XMM3 = rcpps(in_XMM3,auVar95);
            fVar130 = in_XMM3._0_4_;
            fVar159 = in_XMM3._4_4_;
            fVar161 = in_XMM3._8_4_;
            fVar163 = in_XMM3._12_4_;
            sVar9 = this_01->elemsize;
            pvVar52 = this_01->data;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = iVar71;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar8 * sVar10 * uVar51);
              auVar136._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
              auVar136._4_4_ = pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
              auVar136._8_4_ = pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
              auVar136._12_4_ = pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar9 * uVar51) = auVar136;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar71);
    uVar5 = this_00->h;
    local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
    if (iVar4 == 2) {
      local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
      if (this_00[1].dims == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
                pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                   (long)this_00[1].data);
                pauVar57 = (undefined1 (*) [16])
                           ((long)this_00->w * uVar51 * this_00->elemsize + (long)this_00->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar95 = *pauVar57;
                    in_XMM3 = rcpps(in_XMM3,auVar95);
                    fVar130 = in_XMM3._0_4_;
                    fVar159 = in_XMM3._4_4_;
                    fVar161 = in_XMM3._8_4_;
                    fVar163 = in_XMM3._12_4_;
                    uVar64 = uVar66;
                    do {
                      auVar77._0_4_ =
                           *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                      auVar77._4_4_ =
                           pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                      auVar77._8_4_ =
                           pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                      auVar77._12_4_ =
                           pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                      *pauVar59 = auVar77;
                      pfVar56 = pfVar56 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar57 = pauVar57 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims != 1) {
        if (this_00[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_b8) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61);
            in_XMM1 = rcpps(in_XMM1,auVar95);
            pfVar56 = (float *)((long)pvVar62 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            fVar163 = *pfVar56 * in_XMM1._0_4_;
            fVar158 = fVar130 * in_XMM1._4_4_;
            fVar160 = fVar159 * in_XMM1._8_4_;
            fVar162 = fVar161 * in_XMM1._12_4_;
            pfVar55 = (float *)((long)pvVar52 + lVar61);
            *pfVar55 = (*pfVar56 - auVar95._0_4_ * fVar163) * in_XMM1._0_4_ + fVar163;
            pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar158) * in_XMM1._4_4_ + fVar158;
            pfVar55[2] = (fVar159 - auVar95._8_4_ * fVar160) * in_XMM1._8_4_ + fVar160;
            pfVar55[3] = (fVar161 - auVar95._12_4_ * fVar162) * in_XMM1._12_4_ + fVar162;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
      pfVar56 = (float *)this_01->data;
      if (pfVar56 == (float *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if ((int)local_d0 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar5) {
            pauVar59 = (undefined1 (*) [16])this_00->data;
            pfVar55 = (float *)this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar50 = uVar63;
                do {
                  auVar95 = *pauVar59;
                  in_XMM2 = rcpps(in_XMM2,auVar95);
                  fVar158 = fVar130 * in_XMM2._0_4_;
                  fVar160 = fVar159 * in_XMM2._4_4_;
                  fVar162 = fVar161 * in_XMM2._8_4_;
                  fVar164 = fVar163 * in_XMM2._12_4_;
                  *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                  pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                  pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                  pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                  pauVar59 = pauVar59 + 1;
                  pfVar56 = pfVar56 + 4;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar55 = pfVar55 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_b8) {
          fVar130 = *pMVar1->data;
          pvVar52 = this_00->data;
          lVar61 = 0;
          do {
            auVar95 = *(undefined1 (*) [16])((long)pvVar52 + lVar61);
            in_XMM2 = rcpps(in_XMM2,auVar95);
            fVar159 = fVar130 * in_XMM2._0_4_;
            fVar161 = fVar130 * in_XMM2._4_4_;
            fVar163 = fVar130 * in_XMM2._8_4_;
            fVar158 = fVar130 * in_XMM2._12_4_;
            pfVar55 = (float *)((long)pfVar56 + lVar61);
            *pfVar55 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
            pfVar55[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
            pfVar55[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
            pfVar55[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
            lVar61 = lVar61 + 0x10;
            local_b8._0_4_ = (int)local_b8 + -1;
          } while ((int)local_b8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    uVar6 = this_00->c;
    uVar54 = (ulong)uVar6;
    local_c0 = sVar7;
    if (this_00[1].dims != 3) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (this_00[1].dims == 1) {
        if (iVar53 != 1 || this_00[1].w != 1) {
          if (0 < (int)uVar6) {
            uVar50 = 0;
            do {
              if (0 < (int)local_b8) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                pfVar56 = (float *)((long)local_d0->data + uVar50 * 0x10);
                fVar130 = *pfVar56;
                fVar159 = pfVar56[1];
                fVar161 = pfVar56[2];
                fVar163 = pfVar56[3];
                pvVar52 = this_01->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar60 = this_00->data;
                lVar61 = 0;
                iVar49 = (int)local_b8;
                do {
                  auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50)
                  ;
                  in_XMM2 = rcpps(in_XMM2,auVar95);
                  fVar158 = fVar130 * in_XMM2._0_4_;
                  fVar160 = fVar159 * in_XMM2._4_4_;
                  fVar162 = fVar161 * in_XMM2._8_4_;
                  fVar164 = fVar163 * in_XMM2._12_4_;
                  pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                  *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                  pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                  pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                  pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar54);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar130 = *local_d0->data;
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar159 = fVar130 * in_XMM2._0_4_;
                fVar161 = fVar130 * in_XMM2._4_4_;
                fVar163 = fVar130 * in_XMM2._8_4_;
                fVar158 = fVar130 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM2._0_4_ + fVar159;
                pfVar56[1] = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM2._4_4_ + fVar161;
                pfVar56[2] = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM2._8_4_ + fVar163;
                pfVar56[3] = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM2._12_4_ + fVar158;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            pfVar56 = (float *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pfVar55 = (float *)((long)this_00[1].w * uVar50 * this_00[1].elemsize +
                               (long)this_00[1].data);
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar51 = uVar63;
                do {
                  auVar95 = *pauVar59;
                  in_XMM2 = rcpps(in_XMM2,auVar95);
                  fVar158 = fVar130 * in_XMM2._0_4_;
                  fVar160 = fVar159 * in_XMM2._4_4_;
                  fVar162 = fVar161 * in_XMM2._8_4_;
                  fVar164 = fVar163 * in_XMM2._12_4_;
                  *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                  pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                  pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                  pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                  pauVar59 = pauVar59 + 1;
                  pfVar56 = pfVar56 + 4;
                  uVar65 = (int)uVar51 - 1;
                  uVar51 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar55 = pfVar55 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pfVar56 = (float *)((long)this_00[1].data +
                                 this_00[1].cstep * uVar50 * this_00[1].elemsize);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_00->data;
              sVar9 = this_01->cstep;
              sVar10 = this_01->elemsize;
              pvVar60 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                in_XMM2 = rcpps(in_XMM2,auVar95);
                fVar158 = fVar130 * in_XMM2._0_4_;
                fVar160 = fVar159 * in_XMM2._4_4_;
                fVar162 = fVar161 * in_XMM2._8_4_;
                fVar164 = fVar163 * in_XMM2._12_4_;
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_c8 = uVar54;
    if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_c8) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00->data;
              pvVar60 = this_00[1].data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                auVar95 = *(undefined1 (*) [16])
                           ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
                in_XMM1 = rcpps(in_XMM1,auVar95);
                fVar130 = *(float *)((long)pvVar60 + lVar61);
                fVar159 = fVar130 * in_XMM1._0_4_;
                fVar161 = fVar130 * in_XMM1._4_4_;
                fVar163 = fVar130 * in_XMM1._8_4_;
                fVar158 = fVar130 * in_XMM1._12_4_;
                auVar140._0_4_ = (fVar130 - auVar95._0_4_ * fVar159) * in_XMM1._0_4_ + fVar159;
                auVar140._4_4_ = (fVar130 - auVar95._4_4_ * fVar161) * in_XMM1._4_4_ + fVar161;
                auVar140._8_4_ = (fVar130 - auVar95._8_4_ * fVar163) * in_XMM1._8_4_ + fVar163;
                auVar140._12_4_ = (fVar130 - auVar95._12_4_ * fVar158) * in_XMM1._12_4_ + fVar158;
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar140;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_c8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_01->cstep;
              auVar95 = *(undefined1 (*) [16])
                         ((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize);
              in_XMM3 = rcpps(in_XMM3,auVar95);
              fVar130 = in_XMM3._0_4_;
              fVar159 = in_XMM3._4_4_;
              fVar161 = in_XMM3._8_4_;
              fVar163 = in_XMM3._12_4_;
              sVar9 = this_01->elemsize;
              pvVar52 = this_01->data;
              sVar10 = this_00[1].elemsize;
              pvVar60 = this_00[1].data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar7 * sVar10 * uVar51);
                auVar142._0_4_ = *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                auVar142._4_4_ = pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                auVar142._8_4_ = pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                auVar142._12_4_ =
                     pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar8 * sVar9 * uVar51) = auVar142;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 == uVar67) && (iVar49 == 1)) && (uVar65 == uVar5)) && (uVar6 == 1)) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_d0) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              sVar9 = this_01->cstep;
              pvVar52 = this_00[1].data;
              pvVar60 = this_00->data;
              sVar10 = this_01->elemsize;
              pvVar62 = this_01->data;
              lVar61 = 0;
              iVar49 = (int)local_d0;
              do {
                auVar95 = *(undefined1 (*) [16])
                           ((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
                fVar130 = 1.0 / *(float *)((long)pvVar60 + lVar61);
                auVar145._0_4_ = fVar130 * auVar95._0_4_;
                auVar145._4_4_ = fVar130 * auVar95._4_4_;
                auVar145._8_4_ = fVar130 * auVar95._8_4_;
                auVar145._12_4_ = fVar130 * auVar95._12_4_;
                *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                     auVar145;
                lVar61 = lVar61 + 4;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].cstep;
              sVar8 = this_00[1].elemsize;
              pvVar52 = this_00[1].data;
              pfVar56 = (float *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data)
              ;
              pauVar59 = (undefined1 (*) [16])
                         (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              uVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  pfVar55 = (float *)((long)pvVar52 + uVar51 * 0x10 + sVar7 * uVar50 * sVar8);
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar54 = uVar63;
                  do {
                    auVar95 = *pauVar59;
                    in_XMM2 = rcpps(in_XMM2,auVar95);
                    fVar158 = fVar130 * in_XMM2._0_4_;
                    fVar160 = fVar159 * in_XMM2._4_4_;
                    fVar162 = fVar161 * in_XMM2._8_4_;
                    fVar164 = fVar163 * in_XMM2._12_4_;
                    *pfVar56 = (fVar130 - auVar95._0_4_ * fVar158) * in_XMM2._0_4_ + fVar158;
                    pfVar56[1] = (fVar159 - auVar95._4_4_ * fVar160) * in_XMM2._4_4_ + fVar160;
                    pfVar56[2] = (fVar161 - auVar95._8_4_ * fVar162) * in_XMM2._8_4_ + fVar162;
                    pfVar56[3] = (fVar163 - auVar95._12_4_ * fVar164) * in_XMM2._12_4_ + fVar164;
                    pauVar59 = pauVar59 + 1;
                    pfVar56 = pfVar56 + 4;
                    uVar66 = (int)uVar54 - 1;
                    uVar54 = (ulong)uVar66;
                  } while (uVar66 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
      Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          uVar50 = 0;
          do {
            if (0 < (int)uVar5) {
              sVar7 = this_00[1].elemsize;
              pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
              pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
              sVar8 = this_00[1].cstep;
              pvVar52 = this_00[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar67) {
                  lVar61 = 0;
                  do {
                    auVar95 = *(undefined1 (*) [16])((long)pvVar62 + lVar61);
                    in_XMM1 = rcpps(in_XMM1,auVar95);
                    pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                    fVar130 = *pfVar56 * in_XMM1._0_4_;
                    fVar159 = pfVar56[1] * in_XMM1._4_4_;
                    fVar161 = pfVar56[2] * in_XMM1._8_4_;
                    fVar163 = pfVar56[3] * in_XMM1._12_4_;
                    auVar149._0_4_ = (*pfVar56 - auVar95._0_4_ * fVar130) * in_XMM1._0_4_ + fVar130;
                    auVar149._4_4_ =
                         (pfVar56[1] - auVar95._4_4_ * fVar159) * in_XMM1._4_4_ + fVar159;
                    auVar149._8_4_ =
                         (pfVar56[2] - auVar95._8_4_ * fVar161) * in_XMM1._8_4_ + fVar161;
                    auVar149._12_4_ =
                         (pfVar56[3] - auVar95._12_4_ * fVar163) * in_XMM1._12_4_ + fVar163;
                    *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar149;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar63 << 4 != lVar61);
                  pvVar60 = (void *)((long)pvVar60 + lVar61);
                  pvVar62 = (void *)((long)pvVar62 + lVar61);
                }
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar5);
            }
            uVar50 = uVar50 + 1;
          } while ((void *)uVar50 != local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar52 = this_00->data;
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                 (long)this_00[1].data);
              uVar63 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar95 = *(undefined1 (*) [16])
                             ((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                  in_XMM3 = rcpps(in_XMM3,auVar95);
                  fVar130 = in_XMM3._0_4_;
                  fVar159 = in_XMM3._4_4_;
                  fVar161 = in_XMM3._8_4_;
                  fVar163 = in_XMM3._12_4_;
                  uVar67 = uVar66;
                  do {
                    auVar153._0_4_ =
                         *pfVar56 * ((1.0 - auVar95._0_4_ * fVar130) * fVar130 + fVar130);
                    auVar153._4_4_ =
                         pfVar56[1] * ((1.0 - auVar95._4_4_ * fVar159) * fVar159 + fVar159);
                    auVar153._8_4_ =
                         pfVar56[2] * ((1.0 - auVar95._8_4_ * fVar161) * fVar161 + fVar161);
                    auVar153._12_4_ =
                         pfVar56[3] * ((1.0 - auVar95._12_4_ * fVar163) * fVar163 + fVar163);
                    *pauVar59 = auVar153;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = uVar67 - 1;
                  } while (uVar67 != 0);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
      local_d0 = pMVar1;
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)local_d8) {
          iVar49 = 0;
          do {
            Mat::channel((Mat *)local_88,this_00,iVar49);
            auVar48 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,local_d0,iVar49);
            auVar69 = local_88;
            Mat::~Mat((Mat *)local_88);
            Mat::channel((Mat *)local_88,this_01,iVar49);
            auVar73 = local_88;
            Mat::~Mat((Mat *)local_88);
            if (0 < (int)uVar65) {
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  lVar61 = 0;
                  do {
                    auVar95 = *(undefined1 (*) [16])((long)auVar48 + lVar61);
                    in_XMM1 = rcpps(in_XMM1,auVar95);
                    pfVar56 = (float *)((long)auVar69 + lVar61);
                    fVar130 = *pfVar56 * in_XMM1._0_4_;
                    fVar159 = pfVar56[1] * in_XMM1._4_4_;
                    fVar161 = pfVar56[2] * in_XMM1._8_4_;
                    fVar163 = pfVar56[3] * in_XMM1._12_4_;
                    auVar156._0_4_ = (*pfVar56 - auVar95._0_4_ * fVar130) * in_XMM1._0_4_ + fVar130;
                    auVar156._4_4_ =
                         (pfVar56[1] - auVar95._4_4_ * fVar159) * in_XMM1._4_4_ + fVar159;
                    auVar156._8_4_ =
                         (pfVar56[2] - auVar95._8_4_ * fVar161) * in_XMM1._8_4_ + fVar161;
                    auVar156._12_4_ =
                         (pfVar56[3] - auVar95._12_4_ * fVar163) * in_XMM1._12_4_ + fVar163;
                    *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar156;
                    lVar61 = lVar61 + 0x10;
                  } while (uVar51 << 4 != lVar61);
                  auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                  auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
                }
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != (int)local_d8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)local_b8) {
            lVar61 = 0;
            iVar53 = (int)local_b8;
            do {
              auVar95 = *(undefined1 (*) [16])((long)auVar48 + lVar61);
              in_XMM1 = rcpps(in_XMM1,auVar95);
              pfVar56 = (float *)((long)auVar69 + lVar61);
              fVar130 = *pfVar56 * in_XMM1._0_4_;
              fVar159 = pfVar56[1] * in_XMM1._4_4_;
              fVar161 = pfVar56[2] * in_XMM1._8_4_;
              fVar163 = pfVar56[3] * in_XMM1._12_4_;
              auVar157._0_4_ = (*pfVar56 - auVar95._0_4_ * fVar130) * in_XMM1._0_4_ + fVar130;
              auVar157._4_4_ = (pfVar56[1] - auVar95._4_4_ * fVar159) * in_XMM1._4_4_ + fVar159;
              auVar157._8_4_ = (pfVar56[2] - auVar95._8_4_ * fVar161) * in_XMM1._8_4_ + fVar161;
              auVar157._12_4_ = (pfVar56[3] - auVar95._12_4_ * fVar163) * in_XMM1._12_4_ + fVar163;
              *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar157;
              lVar61 = lVar61 + 0x10;
              iVar53 = iVar53 + -1;
            } while (iVar53 != 0);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  uVar67 = this_00->w;
  uVar51 = (ulong)uVar67;
  sVar7 = this_00->elemsize;
  uVar66 = this_00[1].w;
  uVar63 = (ulong)uVar66;
  uVar65 = this_00[1].h;
  uVar64 = this_00[1].c;
  uVar50 = (ulong)uVar64;
  local_d0 = (Mat *)CONCAT44(local_d0._4_4_,uVar65 * uVar66);
  sVar8 = this_00[1].elemsize;
  iVar4 = this_00->dims;
  local_d8 = (void *)uVar50;
  if (iVar4 == 1) {
    if (iVar49 == 1 && uVar67 == 1) {
      iVar4 = this_00[1].dims;
      if (iVar4 == 1) {
        Mat::create(this_01,uVar66,sVar8,iVar53,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar130 = *this_00->data;
            pvVar60 = pMVar1->data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pfVar55 = (float *)((long)pvVar52 + lVar61);
              *pfVar55 = *pfVar56 + fVar130;
              pfVar55[1] = fVar159 + fVar130;
              pfVar55[2] = fVar161 + fVar130;
              pfVar55[3] = fVar163 + fVar130;
              lVar61 = lVar61 + 0x10;
              uVar67 = (int)uVar63 - 1;
              uVar63 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 == 2) {
        Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
        pvVar52 = this_01->data;
        if (pvVar52 == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)local_d0) {
            fVar130 = *this_00->data;
            pvVar60 = pMVar1->data;
            lVar61 = 0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61);
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pfVar55 = (float *)((long)pvVar52 + lVar61);
              *pfVar55 = *pfVar56 + fVar130;
              pfVar55[1] = fVar159 + fVar130;
              pfVar55[2] = fVar161 + fVar130;
              pfVar55[3] = fVar163 + fVar130;
              lVar61 = lVar61 + 0x10;
              local_d0._0_4_ = (int)local_d0 + -1;
            } while ((int)local_d0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar4 == 3) {
        Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
        if (this_01->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_01->c * this_01->cstep != 0) {
          if (0 < (int)uVar64) {
            fVar130 = *this_00->data;
            uVar51 = 0;
            do {
              if (0 < (int)local_d0) {
                sVar7 = this_01->cstep;
                sVar8 = this_01->elemsize;
                pvVar52 = this_01->data;
                sVar9 = this_00[1].cstep;
                sVar10 = this_00[1].elemsize;
                pvVar60 = this_00[1].data;
                lVar61 = 0;
                iVar49 = (int)local_d0;
                do {
                  pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
                  auVar83._0_4_ = *pfVar56 + fVar130;
                  auVar83._4_4_ = pfVar56[1] + fVar130;
                  auVar83._8_4_ = pfVar56[2] + fVar130;
                  auVar83._12_4_ = pfVar56[3] + fVar130;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar83;
                  lVar61 = lVar61 + 0x10;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar4 = this_00[1].dims;
    if (iVar4 == 1) {
      Mat::create(this_01,uVar67,sVar7,iVar49,opt->blob_allocator);
      pvVar52 = this_01->data;
      if (pvVar52 == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (iVar53 != 1 || this_00[1].w != 1) {
        if (0 < (int)uVar67) {
          pvVar60 = this_00->data;
          pvVar62 = this_00[1].data;
          lVar61 = 0;
          do {
            pfVar56 = (float *)((long)pvVar60 + lVar61);
            fVar130 = pfVar56[1];
            fVar159 = pfVar56[2];
            fVar161 = pfVar56[3];
            pfVar55 = (float *)((long)pvVar62 + lVar61);
            fVar163 = pfVar55[1];
            fVar158 = pfVar55[2];
            fVar160 = pfVar55[3];
            pfVar2 = (float *)((long)pvVar52 + lVar61);
            *pfVar2 = *pfVar55 + *pfVar56;
            pfVar2[1] = fVar163 + fVar130;
            pfVar2[2] = fVar158 + fVar159;
            pfVar2[3] = fVar160 + fVar161;
            lVar61 = lVar61 + 0x10;
            uVar67 = (int)uVar51 - 1;
            uVar51 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar67) {
        fVar130 = *pMVar1->data;
        pvVar60 = this_00->data;
        lVar61 = 0;
        do {
          pfVar56 = (float *)((long)pvVar60 + lVar61);
          fVar159 = pfVar56[1];
          fVar161 = pfVar56[2];
          fVar163 = pfVar56[3];
          pfVar55 = (float *)((long)pvVar52 + lVar61);
          *pfVar55 = *pfVar56 + fVar130;
          pfVar55[1] = fVar159 + fVar130;
          pfVar55[2] = fVar161 + fVar130;
          pfVar55[3] = fVar163 + fVar130;
          lVar61 = lVar61 + 0x10;
          uVar67 = (int)uVar51 - 1;
          uVar51 = (ulong)uVar67;
        } while (uVar67 != 0);
        return 0;
      }
      return 0;
    }
    if (iVar4 == 2) {
      Mat::create(this_01,uVar66,uVar65,sVar8,iVar53,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_01->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar65) {
          pfVar56 = (float *)this_00->data;
          pfVar55 = (float *)this_00[1].data;
          uVar67 = 0;
          do {
            if (0 < (int)uVar66) {
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              uVar64 = uVar66;
              do {
                auVar101._0_4_ = *pfVar55 + fVar130;
                auVar101._4_4_ = pfVar55[1] + fVar159;
                auVar101._8_4_ = pfVar55[2] + fVar161;
                auVar101._12_4_ = pfVar55[3] + fVar163;
                *pauVar59 = auVar101;
                pfVar55 = pfVar55 + 4;
                pauVar59 = pauVar59 + 1;
                uVar64 = uVar64 - 1;
              } while (uVar64 != 0);
            }
            pfVar56 = pfVar56 + 4;
            uVar67 = uVar67 + 1;
          } while (uVar67 != uVar65);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar4 != 3) {
      return 0;
    }
    Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
    if (this_01->data != (void *)0x0) {
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            pfVar56 = (float *)((long)this_00->data + uVar51 * 0x10);
            fVar130 = *pfVar56;
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
              auVar86._0_4_ = *pfVar56 + fVar130;
              auVar86._4_4_ = pfVar56[1] + fVar159;
              auVar86._8_4_ = pfVar56[2] + fVar161;
              auVar86._12_4_ = pfVar56[3] + fVar163;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar86;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  uVar5 = this_00->h;
  local_b8 = CONCAT44(local_b8._4_4_,uVar5 * uVar67);
  if (iVar4 == 2) {
    local_d0 = (Mat *)CONCAT44(local_d0._4_4_,iVar53);
    if (this_00[1].dims == 3) {
      Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              pauVar59 = (undefined1 (*) [16])
                         (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
              pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                                 (long)this_00[1].data);
              pfVar55 = (float *)((long)this_00->w * uVar51 * this_00->elemsize +
                                 (long)this_00->data);
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar130 = *pfVar55;
                  fVar159 = pfVar55[1];
                  fVar161 = pfVar55[2];
                  fVar163 = pfVar55[3];
                  uVar64 = uVar66;
                  do {
                    auVar81._0_4_ = *pfVar56 + fVar130;
                    auVar81._4_4_ = pfVar56[1] + fVar159;
                    auVar81._8_4_ = pfVar56[2] + fVar161;
                    auVar81._12_4_ = pfVar56[3] + fVar163;
                    *pauVar59 = auVar81;
                    pfVar56 = pfVar56 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar55 = pfVar55 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
    pvVar52 = this_01->data;
    if (pvVar52 == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep == 0) {
      return -100;
    }
    if (this_00[1].dims != 1) {
      if (this_00[1].dims != 2) {
        return 0;
      }
      if (0 < (int)local_b8) {
        pvVar60 = this_00->data;
        pvVar62 = this_00[1].data;
        lVar61 = 0;
        do {
          pfVar56 = (float *)((long)pvVar60 + lVar61);
          fVar130 = pfVar56[1];
          fVar159 = pfVar56[2];
          fVar161 = pfVar56[3];
          pfVar55 = (float *)((long)pvVar62 + lVar61);
          fVar163 = pfVar55[1];
          fVar158 = pfVar55[2];
          fVar160 = pfVar55[3];
          pfVar2 = (float *)((long)pvVar52 + lVar61);
          *pfVar2 = *pfVar55 + *pfVar56;
          pfVar2[1] = fVar163 + fVar130;
          pfVar2[2] = fVar158 + fVar159;
          pfVar2[3] = fVar160 + fVar161;
          lVar61 = lVar61 + 0x10;
          local_b8._0_4_ = (int)local_b8 + -1;
        } while ((int)local_b8 != 0);
        return 0;
      }
      return 0;
    }
    Mat::create(this_01,uVar67,uVar5,sVar7,iVar49,opt->blob_allocator);
    pauVar59 = (undefined1 (*) [16])this_01->data;
    if (pauVar59 == (undefined1 (*) [16])0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if ((int)local_d0 != 1 || this_00[1].w != 1) {
        if (0 < (int)uVar5) {
          pfVar56 = (float *)this_00->data;
          pfVar55 = (float *)this_00[1].data;
          uVar66 = 0;
          do {
            if (0 < (int)uVar67) {
              fVar130 = *pfVar55;
              fVar159 = pfVar55[1];
              fVar161 = pfVar55[2];
              fVar163 = pfVar55[3];
              uVar50 = uVar51;
              do {
                auVar122._0_4_ = *pfVar56 + fVar130;
                auVar122._4_4_ = pfVar56[1] + fVar159;
                auVar122._8_4_ = pfVar56[2] + fVar161;
                auVar122._12_4_ = pfVar56[3] + fVar163;
                *pauVar59 = auVar122;
                pfVar56 = pfVar56 + 4;
                pauVar59 = pauVar59 + 1;
                uVar65 = (int)uVar50 - 1;
                uVar50 = (ulong)uVar65;
              } while (uVar65 != 0);
            }
            pfVar55 = pfVar55 + 4;
            uVar66 = uVar66 + 1;
          } while (uVar66 != uVar5);
          return 0;
        }
        return 0;
      }
      if (0 < (int)local_b8) {
        fVar130 = *pMVar1->data;
        pvVar52 = this_00->data;
        lVar61 = 0;
        do {
          pfVar56 = (float *)((long)pvVar52 + lVar61);
          fVar159 = pfVar56[1];
          fVar161 = pfVar56[2];
          fVar163 = pfVar56[3];
          pfVar55 = (float *)((long)*pauVar59 + lVar61);
          *pfVar55 = *pfVar56 + fVar130;
          pfVar55[1] = fVar159 + fVar130;
          pfVar55[2] = fVar161 + fVar130;
          pfVar55[3] = fVar163 + fVar130;
          lVar61 = lVar61 + 0x10;
          local_b8._0_4_ = (int)local_b8 + -1;
        } while ((int)local_b8 != 0);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if (iVar4 != 3) {
    return 0;
  }
  uVar6 = this_00->c;
  uVar54 = (ulong)uVar6;
  local_c0 = sVar7;
  if (this_00[1].dims != 3) {
    local_d0 = pMVar1;
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep == 0) {
      return -100;
    }
    if (this_00[1].dims == 1) {
      if (iVar53 != 1 || this_00[1].w != 1) {
        if (0 < (int)uVar6) {
          uVar50 = 0;
          do {
            if (0 < (int)local_b8) {
              sVar7 = this_01->cstep;
              sVar8 = this_01->elemsize;
              pfVar56 = (float *)((long)local_d0->data + uVar50 * 0x10);
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              pvVar52 = this_01->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar61 = 0;
              iVar49 = (int)local_b8;
              do {
                pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
                auVar116._0_4_ = *pfVar56 + fVar130;
                auVar116._4_4_ = pfVar56[1] + fVar159;
                auVar116._8_4_ = pfVar56[2] + fVar161;
                auVar116._12_4_ = pfVar56[3] + fVar163;
                *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar116;
                lVar61 = lVar61 + 0x10;
                iVar49 = iVar49 + -1;
              } while (iVar49 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar54);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar6) {
        fVar130 = *local_d0->data;
        uVar50 = 0;
        do {
          if (0 < (int)local_b8) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            pvVar52 = this_01->data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar60 = this_00->data;
            lVar61 = 0;
            iVar49 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50);
              auVar110._0_4_ = *pfVar56 + fVar130;
              auVar110._4_4_ = pfVar56[1] + fVar130;
              auVar110._8_4_ = pfVar56[2] + fVar130;
              auVar110._12_4_ = pfVar56[3] + fVar130;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50) = auVar110;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    if (this_00[1].dims != 2) {
      return 0;
    }
    if (0 < (int)uVar6) {
      uVar50 = 0;
      do {
        if (0 < (int)uVar5) {
          pauVar59 = (undefined1 (*) [16])
                     (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
          pfVar56 = (float *)((long)this_00[1].w * uVar50 * this_00[1].elemsize +
                             (long)this_00[1].data);
          pfVar55 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
          uVar66 = 0;
          do {
            if (0 < (int)uVar67) {
              fVar130 = *pfVar56;
              fVar159 = pfVar56[1];
              fVar161 = pfVar56[2];
              fVar163 = pfVar56[3];
              uVar63 = uVar51;
              do {
                auVar88._0_4_ = *pfVar55 + fVar130;
                auVar88._4_4_ = pfVar55[1] + fVar159;
                auVar88._8_4_ = pfVar55[2] + fVar161;
                auVar88._12_4_ = pfVar55[3] + fVar163;
                *pauVar59 = auVar88;
                pfVar55 = pfVar55 + 4;
                pauVar59 = pauVar59 + 1;
                uVar65 = (int)uVar63 - 1;
                uVar63 = (ulong)uVar65;
              } while (uVar65 != 0);
            }
            pfVar56 = pfVar56 + 4;
            uVar66 = uVar66 + 1;
          } while (uVar66 != uVar5);
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 != uVar54);
      return 0;
    }
    return 0;
  }
  if (uVar64 == uVar6 && (uVar65 == 1 && (uVar66 ^ 1) == 0)) {
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)uVar6) {
        uVar50 = 0;
        do {
          if (0 < (int)local_b8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pfVar56 = (float *)((long)this_00[1].data +
                               this_00[1].cstep * uVar50 * this_00[1].elemsize);
            fVar130 = *pfVar56;
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pvVar52 = this_00->data;
            sVar9 = this_01->cstep;
            sVar10 = this_01->elemsize;
            pvVar60 = this_01->data;
            lVar61 = 0;
            iVar49 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
              auVar74._0_4_ = *pfVar56 + fVar130;
              auVar74._4_4_ = pfVar56[1] + fVar159;
              auVar74._8_4_ = pfVar56[2] + fVar161;
              auVar74._12_4_ = pfVar56[3] + fVar163;
              *(undefined1 (*) [16])((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar50) = auVar74;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar54);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  local_c8 = uVar54;
  if ((uVar66 == uVar67) && (iVar53 == 1 && (uVar64 == 1 && uVar65 == uVar5))) {
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_c8) {
        uVar50 = 0;
        do {
          if (0 < (int)local_b8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            sVar9 = this_01->cstep;
            pvVar52 = this_00->data;
            pvVar60 = this_00[1].data;
            sVar10 = this_01->elemsize;
            pvVar62 = this_01->data;
            lVar61 = 0;
            iVar49 = (int)local_b8;
            do {
              pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar50);
              fVar130 = *(float *)((long)pvVar60 + lVar61);
              auVar93._0_4_ = fVar130 + *pfVar56;
              auVar93._4_4_ = fVar130 + pfVar56[1];
              auVar93._8_4_ = fVar130 + pfVar56[2];
              auVar93._12_4_ = fVar130 + pfVar56[3];
              *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar50) = auVar93
              ;
              lVar61 = lVar61 + 4;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != local_c8);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if ((uVar5 == 1 && (uVar67 ^ 1) == 0) && uVar6 == uVar64) {
    Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_01->cstep;
            sVar8 = this_01->elemsize;
            pfVar56 = (float *)((long)this_00->data + this_00->cstep * uVar51 * this_00->elemsize);
            fVar130 = *pfVar56;
            fVar159 = pfVar56[1];
            fVar161 = pfVar56[2];
            fVar163 = pfVar56[3];
            pvVar52 = this_01->data;
            sVar9 = this_00[1].cstep;
            sVar10 = this_00[1].elemsize;
            pvVar60 = this_00[1].data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              pfVar56 = (float *)((long)pvVar60 + lVar61 + sVar9 * sVar10 * uVar51);
              auVar98._0_4_ = *pfVar56 + fVar130;
              auVar98._4_4_ = pfVar56[1] + fVar159;
              auVar98._8_4_ = pfVar56[2] + fVar161;
              auVar98._12_4_ = pfVar56[3] + fVar163;
              *(undefined1 (*) [16])((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar51) = auVar98;
              lVar61 = lVar61 + 0x10;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if (((uVar66 == uVar67) && (iVar49 == 1)) && ((uVar65 == uVar5 && (uVar6 == 1)))) {
    Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_d0) {
            sVar7 = this_00[1].cstep;
            sVar8 = this_00[1].elemsize;
            sVar9 = this_01->cstep;
            pvVar52 = this_00[1].data;
            pvVar60 = this_00->data;
            sVar10 = this_01->elemsize;
            pvVar62 = this_01->data;
            lVar61 = 0;
            iVar49 = (int)local_d0;
            do {
              fVar130 = *(float *)((long)pvVar60 + lVar61);
              pfVar56 = (float *)((long)pvVar52 + lVar61 * 4 + sVar7 * sVar8 * uVar51);
              auVar104._0_4_ = *pfVar56 + fVar130;
              auVar104._4_4_ = pfVar56[1] + fVar130;
              auVar104._8_4_ = pfVar56[2] + fVar130;
              auVar104._12_4_ = pfVar56[3] + fVar130;
              *(undefined1 (*) [16])((long)pvVar62 + lVar61 * 4 + sVar9 * sVar10 * uVar51) =
                   auVar104;
              lVar61 = lVar61 + 4;
              iVar49 = iVar49 + -1;
            } while (iVar49 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if ((((uVar66 ^ 1) == 0 && uVar65 == uVar5) && uVar6 == uVar64) && uVar67 != 1) {
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_d8) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = this_00[1].cstep;
            sVar8 = this_00[1].elemsize;
            pvVar52 = this_00[1].data;
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pfVar56 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            uVar63 = 0;
            do {
              if (0 < (int)uVar67) {
                pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar50 * sVar8);
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar54 = uVar51;
                do {
                  auVar106._0_4_ = *pfVar56 + fVar130;
                  auVar106._4_4_ = pfVar56[1] + fVar159;
                  auVar106._8_4_ = pfVar56[2] + fVar161;
                  auVar106._12_4_ = pfVar56[3] + fVar163;
                  *pauVar59 = auVar106;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar66 = (int)uVar54 - 1;
                  uVar54 = (ulong)uVar66;
                } while (uVar66 != 0);
              }
              uVar63 = uVar63 + 1;
            } while (uVar63 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while ((void *)uVar50 != local_d8);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if (((uVar65 == 1 && (uVar66 ^ uVar67) == 0) && uVar64 == uVar6) && uVar5 != 1) {
    Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_d8) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = this_00[1].elemsize;
            pvVar60 = (void *)(this_01->cstep * uVar50 * this_01->elemsize + (long)this_01->data);
            pvVar62 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            sVar8 = this_00[1].cstep;
            pvVar52 = this_00[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                lVar61 = 0;
                do {
                  pfVar56 = (float *)((long)pvVar62 + lVar61);
                  pfVar55 = (float *)((long)pvVar52 + lVar61 + sVar7 * sVar8 * uVar50);
                  auVar114._0_4_ = *pfVar55 + *pfVar56;
                  auVar114._4_4_ = pfVar55[1] + pfVar56[1];
                  auVar114._8_4_ = pfVar55[2] + pfVar56[2];
                  auVar114._12_4_ = pfVar55[3] + pfVar56[3];
                  *(undefined1 (*) [16])((long)pvVar60 + lVar61) = auVar114;
                  lVar61 = lVar61 + 0x10;
                } while (uVar51 << 4 != lVar61);
                pvVar60 = (void *)((long)pvVar60 + lVar61);
                pvVar62 = (void *)((long)pvVar62 + lVar61);
              }
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar5);
          }
          uVar50 = uVar50 + 1;
        } while ((void *)uVar50 != local_d8);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if ((((uVar67 ^ 1) == 0 && uVar5 == uVar65) && uVar64 == uVar6) && uVar66 != 1) {
    Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)uVar65) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar52 = this_00->data;
            pauVar59 = (undefined1 (*) [16])
                       (this_01->cstep * uVar51 * this_01->elemsize + (long)this_01->data);
            pfVar56 = (float *)(this_00[1].cstep * uVar51 * this_00[1].elemsize +
                               (long)this_00[1].data);
            uVar63 = 0;
            do {
              if (0 < (int)uVar66) {
                pfVar55 = (float *)((long)pvVar52 + uVar63 * 0x10 + sVar7 * uVar51 * sVar8);
                fVar130 = *pfVar55;
                fVar159 = pfVar55[1];
                fVar161 = pfVar55[2];
                fVar163 = pfVar55[3];
                uVar67 = uVar66;
                do {
                  auVar120._0_4_ = *pfVar56 + fVar130;
                  auVar120._4_4_ = pfVar56[1] + fVar159;
                  auVar120._8_4_ = pfVar56[2] + fVar161;
                  auVar120._12_4_ = pfVar56[3] + fVar163;
                  *pauVar59 = auVar120;
                  pfVar56 = pfVar56 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar67 = uVar67 - 1;
                } while (uVar67 != 0);
              }
              uVar63 = uVar63 + 1;
            } while (uVar63 != uVar65);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if ((((uVar66 ^ uVar67) == 0 && uVar5 == 1) && uVar6 == uVar64) && uVar65 != 1) {
    local_d0 = pMVar1;
    Mat::create(this_01,uVar66,uVar65,uVar64,sVar8,iVar53,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep != 0) {
      if (0 < (int)local_d8) {
        iVar49 = 0;
        do {
          Mat::channel((Mat *)local_88,this_00,iVar49);
          auVar48 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,local_d0,iVar49);
          auVar69 = local_88;
          Mat::~Mat((Mat *)local_88);
          Mat::channel((Mat *)local_88,this_01,iVar49);
          auVar73 = local_88;
          Mat::~Mat((Mat *)local_88);
          if (0 < (int)uVar65) {
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                lVar61 = 0;
                do {
                  pfVar56 = (float *)((long)auVar48 + lVar61);
                  pfVar55 = (float *)((long)auVar69 + lVar61);
                  auVar126._0_4_ = *pfVar55 + *pfVar56;
                  auVar126._4_4_ = pfVar55[1] + pfVar56[1];
                  auVar126._8_4_ = pfVar55[2] + pfVar56[2];
                  auVar126._12_4_ = pfVar55[3] + pfVar56[3];
                  *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar126;
                  lVar61 = lVar61 + 0x10;
                } while (uVar63 << 4 != lVar61);
                auVar73 = (undefined1  [8])((long)auVar73 + lVar61);
                auVar69 = (undefined1  [8])((long)auVar69 + lVar61);
              }
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != (int)local_d8);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  local_d0 = pMVar1;
  Mat::create(this_01,uVar67,uVar5,uVar6,sVar7,iVar49,opt->blob_allocator);
  if (this_01->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_01->c * this_01->cstep != 0) {
    if (0 < (int)local_c8) {
      iVar49 = 0;
      do {
        Mat::channel((Mat *)local_88,this_00,iVar49);
        auVar48 = local_88;
        Mat::~Mat((Mat *)local_88);
        Mat::channel((Mat *)local_88,local_d0,iVar49);
        auVar69 = local_88;
        Mat::~Mat((Mat *)local_88);
        Mat::channel((Mat *)local_88,this_01,iVar49);
        auVar73 = local_88;
        Mat::~Mat((Mat *)local_88);
        if (0 < (int)local_b8) {
          lVar61 = 0;
          iVar53 = (int)local_b8;
          do {
            pfVar56 = (float *)((long)auVar48 + lVar61);
            pfVar55 = (float *)((long)auVar69 + lVar61);
            auVar129._0_4_ = *pfVar55 + *pfVar56;
            auVar129._4_4_ = pfVar55[1] + pfVar56[1];
            auVar129._8_4_ = pfVar55[2] + pfVar56[2];
            auVar129._12_4_ = pfVar55[3] + pfVar56[3];
            *(undefined1 (*) [16])((long)auVar73 + lVar61) = auVar129;
            lVar61 = lVar61 + 0x10;
            iVar53 = iVar53 + -1;
          } while (iVar53 != 0);
        }
        iVar49 = iVar49 + 1;
      } while (iVar49 != (int)local_c8);
      return 0;
    }
    return 0;
  }
  return -100;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}